

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int param_2,bool param_3)

{
  undefined8 *puVar1;
  uint *puVar2;
  double dVar3;
  uint uVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar6;
  long lVar7;
  long *plVar8;
  long lVar9;
  long *plVar10;
  long *plVar11;
  long *plVar12;
  long *plVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  bool bVar24;
  int iVar25;
  fpclass_type fVar26;
  int iVar27;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar28;
  undefined4 extraout_var_10;
  cpp_dec_float<50U,_int,_void> *pcVar29;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  cpp_dec_float<50U,_int,_void> *pcVar30;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined8 uVar31;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  long lVar34;
  long lVar35;
  cpp_dec_float<50U,_int,_void> *pcVar36;
  long lVar37;
  long lVar38;
  undefined1 *puVar39;
  long in_FS_OFFSET;
  ulong uVar40;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  uint local_79c;
  cpp_dec_float<50U,_int,_void> local_798;
  cpp_dec_float<50U,_int,_void> local_758;
  cpp_dec_float<50U,_int,_void> local_718;
  SPxId enterId;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  ulong local_690;
  cpp_dec_float<50U,_int,_void> local_678;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_5e8;
  cpp_dec_float<50U,_int,_void> local_5a8;
  cpp_dec_float<50U,_int,_void> local_568;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  degeneps;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  cpp_dec_float<50U,_int,_void> local_4a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rmaxabs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  cmaxabs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minStability;
  cpp_dec_float<50U,_int,_void> local_3a8;
  cpp_dec_float<50U,_int,_void> local_368;
  cpp_dec_float<50U,_int,_void> local_328;
  cpp_dec_float<50U,_int,_void> local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  cpp_dec_float<50u,int,void> local_a8 [16];
  undefined1 local_98 [13];
  undefined3 uStack_8b;
  undefined1 auStack_88 [13];
  undefined8 local_78;
  cpp_dec_float<50u,int,void> local_68 [16];
  undefined1 local_58 [13];
  undefined3 uStack_4b;
  undefined1 auStack_48 [13];
  undefined8 local_38;
  undefined8 uVar32;
  undefined8 uVar33;
  
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  local_678.fpclass = cpp_dec_float_finite;
  local_678.prec_elem = 10;
  local_678.data._M_elems[0] = 0;
  local_678.data._M_elems[1] = 0;
  local_678.data._M_elems[2] = 0;
  local_678.data._M_elems[3] = 0;
  local_678.data._M_elems[4] = 0;
  local_678.data._M_elems[5] = 0;
  local_678.data._M_elems[6] = 0;
  local_678.data._M_elems[7] = 0;
  local_678.data._M_elems[8] = 0;
  local_678.data._M_elems[9] = 0;
  local_678.exp = 0;
  local_678.neg = false;
  local_798.fpclass = cpp_dec_float_finite;
  local_798.prec_elem = 10;
  local_798.data._M_elems[0] = 0;
  local_798.data._M_elems[1] = 0;
  local_798.data._M_elems[2] = 0;
  local_798.data._M_elems[3] = 0;
  local_798.data._M_elems[4] = 0;
  local_798.data._M_elems[5] = 0;
  local_798.data._M_elems[6] = 0;
  local_798.data._M_elems[7] = 0;
  local_798.data._M_elems[8] = 0;
  local_798.data._M_elems[9] = 0;
  local_798.exp = 0;
  local_798.neg = false;
  local_758.fpclass = cpp_dec_float_finite;
  local_758.prec_elem = 10;
  local_758.data._M_elems[0] = 0;
  local_758.data._M_elems[1] = 0;
  local_758.data._M_elems[2] = 0;
  local_758.data._M_elems[3] = 0;
  local_758.data._M_elems[4] = 0;
  local_758.data._M_elems[5] = 0;
  local_758.data._M_elems._24_5_ = 0;
  local_758.data._M_elems[7]._1_3_ = 0;
  local_758.data._M_elems._32_5_ = 0;
  local_758.data._M_elems[9]._1_3_ = 0;
  local_758.exp = 0;
  local_758.neg = false;
  local_568.fpclass = cpp_dec_float_finite;
  local_568.prec_elem = 10;
  local_568.data._M_elems[0] = 0;
  local_568.data._M_elems[1] = 0;
  local_568.data._M_elems[2] = 0;
  local_568.data._M_elems[3] = 0;
  local_568.data._M_elems[4] = 0;
  local_568.data._M_elems[5] = 0;
  local_568.data._M_elems[6] = 0;
  local_568.data._M_elems[7] = 0;
  local_568.data._M_elems._32_5_ = 0;
  local_568.data._M_elems[9]._1_3_ = 0;
  local_568.exp = 0;
  local_568.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_568,0.0);
  local_718.fpclass = cpp_dec_float_finite;
  local_718.prec_elem = 10;
  local_718.data._M_elems[0] = 0;
  local_718.data._M_elems[1] = 0;
  local_718.data._M_elems[2] = 0;
  local_718.data._M_elems[3] = 0;
  local_718.data._M_elems[4] = 0;
  local_718.data._M_elems[5] = 0;
  local_718.data._M_elems._24_5_ = 0;
  local_718.data._M_elems[7]._1_3_ = 0;
  local_718.data._M_elems._32_5_ = 0;
  local_718.data._M_elems[9]._1_3_ = 0;
  local_718.exp = 0;
  local_718.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_718,0.0);
  local_4a8.fpclass = cpp_dec_float_finite;
  local_4a8.prec_elem = 10;
  local_4a8.data._M_elems[0] = 0;
  local_4a8.data._M_elems[1] = 0;
  local_4a8.data._M_elems[2] = 0;
  local_4a8.data._M_elems[3] = 0;
  local_4a8.data._M_elems[4] = 0;
  local_4a8.data._M_elems[5] = 0;
  local_4a8.data._M_elems._24_5_ = 0;
  local_4a8.data._M_elems[7]._1_3_ = 0;
  local_4a8.data._M_elems._32_5_ = 0;
  local_4a8.data._M_elems[9]._1_3_ = 0;
  local_4a8.exp = 0;
  local_4a8.neg = false;
  local_5a8.fpclass = cpp_dec_float_finite;
  local_5a8.prec_elem = 10;
  local_5a8.data._M_elems[0] = 0;
  local_5a8.data._M_elems[1] = 0;
  local_5a8.data._M_elems[2] = 0;
  local_5a8.data._M_elems[3] = 0;
  local_5a8.data._M_elems[4] = 0;
  local_5a8.data._M_elems[5] = 0;
  local_5a8.data._M_elems._24_5_ = 0;
  local_5a8.data._M_elems[7]._1_3_ = 0;
  local_5a8.data._M_elems._32_5_ = 0;
  local_5a8.data._M_elems[9]._1_3_ = 0;
  local_5a8.exp = 0;
  local_5a8.neg = false;
  local_5e8.fpclass = cpp_dec_float_finite;
  local_5e8.prec_elem = 10;
  local_5e8.data._M_elems[0] = 0;
  local_5e8.data._M_elems[1] = 0;
  local_5e8.data._M_elems[2] = 0;
  local_5e8.data._M_elems[3] = 0;
  local_5e8.data._M_elems[4] = 0;
  local_5e8.data._M_elems[5] = 0;
  local_5e8.data._M_elems._24_5_ = 0;
  local_5e8.data._M_elems[7]._1_3_ = 0;
  local_5e8.data._M_elems._32_5_ = 0;
  local_5e8.data._M_elems[9]._1_3_ = 0;
  local_5e8.exp = 0;
  local_5e8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&cmaxabs.m_backend,1,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&rmaxabs.m_backend,1,(type *)0x0);
  peVar5 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar3 = peVar5->s_epsilon_multiplier;
  uVar40 = -(ulong)(dVar3 == 1.0);
  minStability.m_backend.fpclass = cpp_dec_float_finite;
  minStability.m_backend.prec_elem = 10;
  minStability.m_backend.data._M_elems[0] = 0;
  minStability.m_backend.data._M_elems[1] = 0;
  minStability.m_backend.data._M_elems[2] = 0;
  minStability.m_backend.data._M_elems[3] = 0;
  minStability.m_backend.data._M_elems[4] = 0;
  minStability.m_backend.data._M_elems[5] = 0;
  minStability.m_backend.data._M_elems._24_5_ = 0;
  minStability.m_backend.data._M_elems[7]._1_3_ = 0;
  minStability.m_backend.data._M_elems._32_5_ = 0;
  minStability.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&minStability,
             (double)(~uVar40 & (ulong)(dVar3 * 0.0001) | uVar40 & 0x3f1a36e2eb1c432d));
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  iVar25 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  a = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var,iVar25) + 0x1e0));
  epsilon.m_backend.fpclass = cpp_dec_float_finite;
  epsilon.m_backend.prec_elem = 10;
  epsilon.m_backend.data._M_elems[0] = 0;
  epsilon.m_backend.data._M_elems[1] = 0;
  epsilon.m_backend.data._M_elems[2] = 0;
  epsilon.m_backend.data._M_elems[3] = 0;
  epsilon.m_backend.data._M_elems[4] = 0;
  epsilon.m_backend.data._M_elems[5] = 0;
  epsilon.m_backend.data._M_elems._24_5_ = 0;
  epsilon.m_backend.data._M_elems[7]._1_3_ = 0;
  epsilon.m_backend.data._M_elems._32_5_ = 0;
  epsilon.m_backend.data._M_elems[9]._1_3_ = 0;
  epsilon.m_backend.exp = 0;
  epsilon.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&epsilon,a);
  degenerateEps(&degeneps,this);
  iVar25 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar6 = *(long **)(CONCAT44(extraout_var_00,iVar25) + 0xa60);
  iVar25 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar7 = *(long *)(CONCAT44(extraout_var_01,iVar25) + 0xa60);
  iVar25 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar8 = *(long **)(CONCAT44(extraout_var_02,iVar25) + 0xa58);
  iVar25 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar9 = *(long *)(CONCAT44(extraout_var_03,iVar25) + 0xa58);
  iVar25 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar10 = *(long **)(CONCAT44(extraout_var_04,iVar25) + 0xa78);
  iVar25 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar11 = *(long **)(CONCAT44(extraout_var_05,iVar25) + 0xa80);
  iVar25 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar12 = *(long **)(CONCAT44(extraout_var_06,iVar25) + 0xa88);
  iVar25 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar13 = *(long **)(CONCAT44(extraout_var_07,iVar25) + 0xa90);
  iVar25 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_08,iVar25) + 0xa58) + 0x50));
  iVar25 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_09,iVar25) + 0xa60) + 0x50));
  if ((((val->m_backend).fpclass != cpp_dec_float_NaN) &&
      (epsilon.m_backend.fpclass != cpp_dec_float_NaN)) &&
     (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&val->m_backend,&epsilon.m_backend), 0 < iVar25)) {
    dVar3 = *(double *)(in_FS_OFFSET + -8);
    pnVar28 = &(this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).delta;
LAB_002ab2d5:
    do {
      do {
        uVar33 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
        local_568.data._M_elems._32_5_ = SUB85(uVar33,0);
        local_568.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
        local_568.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
        local_568.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
        local_568.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
        local_568.data._M_elems[6] = (val->m_backend).data._M_elems[6];
        local_568.data._M_elems[7] = (val->m_backend).data._M_elems[7];
        local_568.exp = (val->m_backend).exp;
        local_568.neg = (val->m_backend).neg;
        local_568.fpclass = (val->m_backend).fpclass;
        local_568.prec_elem = (val->m_backend).prec_elem;
        iVar25 = (*(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])(this);
        (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar25) + 0x368))
                  (&result_4,(long *)CONCAT44(extraout_var_10,iVar25));
        auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
        local_4a8.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
        local_4a8.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
        local_4a8.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
        local_4a8.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
        local_4a8.data._M_elems._24_5_ =
             SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],result_4.m_backend.data._M_elems[6])
                   ,0);
        local_4a8.data._M_elems[7]._1_3_ = (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
        local_4a8.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
        local_4a8.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
        local_4a8.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
        local_4a8.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
        local_4a8.exp = result_4.m_backend.exp;
        local_4a8.neg = result_4.m_backend.neg;
        local_4a8.fpclass = result_4.m_backend.fpclass;
        local_4a8.prec_elem = result_4.m_backend.prec_elem;
        result_4.m_backend.data._M_elems._0_16_ = auVar20;
        maxDelta(this,&rmaxabs,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_568,*(int *)(lVar7 + 0x58),*(int **)(lVar7 + 0x60),
                 *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   **)(lVar7 + 0x70),
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)*plVar6,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)*plVar11,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)*plVar10);
        maxDelta(this,&cmaxabs,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_568,*(int *)(lVar9 + 0x58),*(int **)(lVar9 + 0x60),
                 *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   **)(lVar9 + 0x70),
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)*plVar8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)*plVar13,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)*plVar12);
        if (((local_568.fpclass != cpp_dec_float_NaN) &&
            ((val->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_568,&val->m_backend), iVar25 == 0)) {
          uVar33._0_4_ = enterId.super_DataKey.info;
          uVar33._4_4_ = enterId.super_DataKey.idx;
          return (SPxId)uVar33;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_678,0);
        ::soplex::infinity::__tls_init();
        result_4.m_backend.fpclass = cpp_dec_float_finite;
        result_4.m_backend.prec_elem = 10;
        result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems[4] = 0;
        result_4.m_backend.data._M_elems[5] = 0;
        result_4.m_backend.data._M_elems[6] = 0;
        result_4.m_backend.data._M_elems[7] = 0;
        result_4.m_backend.data._M_elems._32_5_ = 0;
        result_4.m_backend.data._M_elems[9]._1_3_ = 0;
        result_4.m_backend.exp = 0;
        result_4.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&result_4,-dVar3);
        local_718.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
        local_718.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
        local_718.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
        local_718.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
        local_718.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
        local_718.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
        local_718.data._M_elems._24_5_ =
             SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],result_4.m_backend.data._M_elems[6])
                   ,0);
        local_718.data._M_elems[7]._1_3_ = (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
        local_718.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
        local_718.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
        local_718.exp = result_4.m_backend.exp;
        local_718.neg = result_4.m_backend.neg;
        local_718.fpclass = result_4.m_backend.fpclass;
        local_718.prec_elem = result_4.m_backend.prec_elem;
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        result_4.m_backend.fpclass = cpp_dec_float_finite;
        result_4.m_backend.prec_elem = 10;
        result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems[4] = 0;
        result_4.m_backend.data._M_elems[5] = 0;
        result_4.m_backend.data._M_elems[6] = 0;
        result_4.m_backend.data._M_elems[7] = 0;
        result_4.m_backend.data._M_elems._32_5_ = 0;
        result_4.m_backend.data._M_elems[9]._1_3_ = 0;
        result_4.m_backend.exp = 0;
        result_4.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&result_4,0.001);
        result.m_backend.data._M_elems[0] = rmaxabs.m_backend.data._M_elems[0];
        result.m_backend.data._M_elems[1] = rmaxabs.m_backend.data._M_elems[1];
        result.m_backend.data._M_elems[2] = rmaxabs.m_backend.data._M_elems[2];
        result.m_backend.data._M_elems[3] = rmaxabs.m_backend.data._M_elems[3];
        result.m_backend.data._M_elems[4] = rmaxabs.m_backend.data._M_elems[4];
        result.m_backend.data._M_elems[5] = rmaxabs.m_backend.data._M_elems[5];
        result.m_backend.data._M_elems._24_5_ = rmaxabs.m_backend.data._M_elems._24_5_;
        result.m_backend.data._M_elems[7]._1_3_ = rmaxabs.m_backend.data._M_elems[7]._1_3_;
        result.m_backend.data._M_elems._32_5_ = rmaxabs.m_backend.data._M_elems._32_5_;
        result.m_backend.data._M_elems[9]._1_3_ = rmaxabs.m_backend.data._M_elems[9]._1_3_;
        result.m_backend.exp = rmaxabs.m_backend.exp;
        result.m_backend.neg = rmaxabs.m_backend.neg;
        result.m_backend.fpclass = rmaxabs.m_backend.fpclass;
        result.m_backend.prec_elem = rmaxabs.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result.m_backend,&result_4.m_backend);
        result_1.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
        result_1.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
        result_1.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
        result_1.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
        result_1.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
        result_1.m_backend.data._M_elems[7] =
             (uint)(CONCAT35(result.m_backend.data._M_elems[7]._1_3_,
                             result.m_backend.data._M_elems._24_5_) >> 0x20);
        result_1.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
        result_1.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
        result_1.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
        result_1.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
        result_1.m_backend.exp = result.m_backend.exp;
        result_1.m_backend.neg = result.m_backend.neg;
        result_1.m_backend.fpclass = result.m_backend.fpclass;
        result_1.m_backend.prec_elem = result.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result_1.m_backend,&epsilon.m_backend);
        local_5e8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
        local_5e8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
        local_5e8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
        local_5e8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
        local_5e8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
        local_5e8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
        local_5e8.data._M_elems._24_5_ =
             SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],result_1.m_backend.data._M_elems[6])
                   ,0);
        local_5e8.data._M_elems[7]._1_3_ = (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
        local_5e8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
        local_5e8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
        local_5e8.exp = result_1.m_backend.exp;
        local_5e8.neg = result_1.m_backend.neg;
        local_5e8.fpclass = result_1.m_backend.fpclass;
        local_5e8.prec_elem = result_1.m_backend.prec_elem;
        if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
            (epsilon.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_5e8,&epsilon.m_backend), iVar25 < 0)) {
          local_5e8.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
          local_5e8.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
          local_5e8.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
          local_5e8.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
          local_5e8.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
          local_5e8.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
          local_5e8.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
          local_5e8.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
          local_5e8.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
          local_5e8.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
          local_5e8.exp = epsilon.m_backend.exp;
          local_5e8.neg = epsilon.m_backend.neg;
          local_5e8.fpclass = epsilon.m_backend.fpclass;
          local_5e8.prec_elem = epsilon.m_backend.prec_elem;
        }
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        result_4.m_backend.fpclass = cpp_dec_float_finite;
        result_4.m_backend.prec_elem = 10;
        result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems[4] = 0;
        result_4.m_backend.data._M_elems[5] = 0;
        result_4.m_backend.data._M_elems[6] = 0;
        result_4.m_backend.data._M_elems[7] = 0;
        result_4.m_backend.data._M_elems._32_5_ = 0;
        result_4.m_backend.data._M_elems[9]._1_3_ = 0;
        result_4.m_backend.exp = 0;
        result_4.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&result_4,0.001);
        result.m_backend.data._M_elems[0] = cmaxabs.m_backend.data._M_elems[0];
        result.m_backend.data._M_elems[1] = cmaxabs.m_backend.data._M_elems[1];
        result.m_backend.data._M_elems[2] = cmaxabs.m_backend.data._M_elems[2];
        result.m_backend.data._M_elems[3] = cmaxabs.m_backend.data._M_elems[3];
        result.m_backend.data._M_elems[4] = cmaxabs.m_backend.data._M_elems[4];
        result.m_backend.data._M_elems[5] = cmaxabs.m_backend.data._M_elems[5];
        result.m_backend.data._M_elems._24_5_ = cmaxabs.m_backend.data._M_elems._24_5_;
        result.m_backend.data._M_elems[7]._1_3_ = cmaxabs.m_backend.data._M_elems[7]._1_3_;
        result.m_backend.data._M_elems._32_5_ = cmaxabs.m_backend.data._M_elems._32_5_;
        result.m_backend.data._M_elems[9]._1_3_ = cmaxabs.m_backend.data._M_elems[9]._1_3_;
        result.m_backend.exp = cmaxabs.m_backend.exp;
        result.m_backend.neg = cmaxabs.m_backend.neg;
        result.m_backend.fpclass = cmaxabs.m_backend.fpclass;
        result.m_backend.prec_elem = cmaxabs.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result.m_backend,&result_4.m_backend);
        result_1.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
        result_1.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
        result_1.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
        result_1.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
        result_1.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
        result_1.m_backend.data._M_elems[7] =
             (uint)(CONCAT35(result.m_backend.data._M_elems[7]._1_3_,
                             result.m_backend.data._M_elems._24_5_) >> 0x20);
        result_1.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
        result_1.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
        result_1.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
        result_1.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
        result_1.m_backend.exp = result.m_backend.exp;
        result_1.m_backend.neg = result.m_backend.neg;
        result_1.m_backend.fpclass = result.m_backend.fpclass;
        result_1.m_backend.prec_elem = result.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result_1.m_backend,&epsilon.m_backend);
        auVar20 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
        local_5a8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
        local_5a8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
        local_5a8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
        local_5a8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
        local_5a8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
        local_5a8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
        local_5a8.data._M_elems._24_5_ =
             SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],result_1.m_backend.data._M_elems[6])
                   ,0);
        local_5a8.data._M_elems[7]._1_3_ = (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
        local_5a8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
        local_5a8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
        local_5a8.exp = result_1.m_backend.exp;
        local_5a8.neg = result_1.m_backend.neg;
        local_5a8.fpclass = result_1.m_backend.fpclass;
        local_5a8.prec_elem = result_1.m_backend.prec_elem;
        result_1.m_backend.data._M_elems._0_16_ = auVar20;
        if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
            (epsilon.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_5a8,&epsilon.m_backend), iVar25 < 0)) {
          local_5a8.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
          local_5a8.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
          local_5a8.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
          local_5a8.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
          local_5a8.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
          local_5a8.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
          local_5a8.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
          local_5a8.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
          local_5a8.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
          local_5a8.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
          local_5a8.exp = epsilon.m_backend.exp;
          local_5a8.neg = epsilon.m_backend.neg;
          local_5a8.fpclass = epsilon.m_backend.fpclass;
          local_5a8.prec_elem = epsilon.m_backend.prec_elem;
        }
        local_690 = 0xffffffff;
        local_79c = 0xffffffff;
        if (0 < (long)*(int *)(lVar7 + 0x58)) {
          lVar35 = (long)*(int *)(lVar7 + 0x58) + 1;
          local_79c = 0xffffffff;
          do {
            lVar38 = *(long *)(lVar7 + 0x70);
            uVar4 = *(uint *)(*(long *)(lVar7 + 0x60) + -8 + lVar35 * 4);
            lVar37 = (long)(int)uVar4 * 0x38;
            local_798.exp = *(int *)(lVar38 + 0x28 + lVar37);
            local_798.neg = *(bool *)(lVar38 + 0x2c + lVar37);
            local_798._48_8_ = *(undefined8 *)(lVar38 + 0x30 + lVar37);
            uVar14 = *(undefined8 *)(lVar38 + lVar37);
            uVar15 = ((undefined8 *)(lVar38 + lVar37))[1];
            puVar1 = (undefined8 *)(lVar38 + 0x10 + lVar37);
            uVar16 = *puVar1;
            uVar17 = puVar1[1];
            uVar33 = *(undefined8 *)(lVar38 + 0x20 + lVar37);
            local_798.data._M_elems[8] = (uint)uVar33;
            local_798.data._M_elems[9] = (uint)((ulong)uVar33 >> 0x20);
            local_798.data._M_elems[4] = (uint)uVar16;
            local_798.data._M_elems[5] = (uint)((ulong)uVar16 >> 0x20);
            local_798.data._M_elems[6] = (uint)uVar17;
            local_798.data._M_elems[7] = (uint)((ulong)uVar17 >> 0x20);
            local_798.data._M_elems[0] = (uint)uVar14;
            local_798.data._M_elems[1] = (uint)((ulong)uVar14 >> 0x20);
            local_798.data._M_elems[2] = (uint)uVar15;
            local_798.data._M_elems[3] = (uint)((ulong)uVar15 >> 0x20);
            if (((local_798.fpclass == cpp_dec_float_NaN) ||
                (local_5e8.fpclass == cpp_dec_float_NaN)) ||
               (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_798,&local_5e8), iVar25 < 1)) {
              result_4.m_backend.data._M_elems[2] = local_5e8.data._M_elems[2];
              result_4.m_backend.data._M_elems[3] = local_5e8.data._M_elems[3];
              result_4.m_backend.data._M_elems[0] = local_5e8.data._M_elems[0];
              result_4.m_backend.data._M_elems[1] = local_5e8.data._M_elems[1];
              auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
              result_4.m_backend.data._M_elems._32_5_ = local_5e8.data._M_elems._32_5_;
              result_4.m_backend.data._M_elems[9]._1_3_ = local_5e8.data._M_elems[9]._1_3_;
              result_4.m_backend.data._M_elems[4] = local_5e8.data._M_elems[4];
              result_4.m_backend.data._M_elems[5] = local_5e8.data._M_elems[5];
              result_4.m_backend.data._M_elems[6] = local_5e8.data._M_elems[6];
              result_4.m_backend.data._M_elems[7] =
                   (uint)(CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_)
                         >> 0x20);
              result_4.m_backend.exp = local_5e8.exp;
              result_4.m_backend.neg = local_5e8.neg;
              result_4.m_backend.fpclass = local_5e8.fpclass;
              result_4.m_backend.prec_elem = local_5e8.prec_elem;
              result_4.m_backend.data._M_elems[0] = local_5e8.data._M_elems[0];
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  local_5e8.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(local_5e8.neg ^ 1);
              }
              result_4.m_backend.data._M_elems._0_16_ = auVar20;
              if (((local_5e8.fpclass == cpp_dec_float_NaN) ||
                  (local_798.fpclass == cpp_dec_float_NaN)) ||
                 (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_798,&result_4.m_backend), -1 < iVar25)) {
                lVar38 = *(long *)(lVar7 + 0x60);
                lVar37 = *(long *)(lVar7 + 0x70);
                lVar34 = (long)*(int *)(lVar38 + -8 + lVar35 * 4) * 0x38;
                *(undefined8 *)(lVar37 + 0x30 + lVar34) = 0xa00000000;
                *(undefined1 (*) [16])(lVar37 + lVar34) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar37 + 0x10 + lVar34) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar37 + 0x1d + lVar34) = (undefined1  [16])0x0;
                iVar25 = *(int *)(lVar7 + 0x58);
                *(int *)(lVar7 + 0x58) = iVar25 + -1;
                *(undefined4 *)(lVar38 + -8 + lVar35 * 4) =
                     *(undefined4 *)(lVar38 + -4 + (long)iVar25 * 4);
                uVar14 = result_4.m_backend._48_8_;
              }
              else {
                pcVar29 = (cpp_dec_float<50U,_int,_void> *)(*plVar11 + lVar37);
                result_4.m_backend.fpclass = cpp_dec_float_finite;
                result_4.m_backend.prec_elem = 10;
                result_4.m_backend.data._M_elems[0] = 0;
                result_4.m_backend.data._M_elems[1] = 0;
                result_4.m_backend.data._M_elems[2] = 0;
                result_4.m_backend.data._M_elems[3] = 0;
                result_4.m_backend.data._M_elems[4] = 0;
                result_4.m_backend.data._M_elems[5] = 0;
                result_4.m_backend.data._M_elems[6] = 0;
                result_4.m_backend.data._M_elems[7] = 0;
                result_4.m_backend.data._M_elems._32_5_ = 0;
                result_4.m_backend.data._M_elems[9]._1_3_ = 0;
                result_4.m_backend.exp = 0;
                result_4.m_backend.neg = false;
                if (&result_4.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar37)) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&result_4.m_backend,pcVar29);
                  if (result_4.m_backend.data._M_elems[0] != 0 ||
                      result_4.m_backend.fpclass != cpp_dec_float_finite) {
                    result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
                  }
                }
                else {
                  if (&result_4.m_backend != pcVar29) {
                    uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 8);
                    result_4.m_backend.data._M_elems._32_5_ = SUB85(uVar33,0);
                    result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
                    result_4.m_backend.data._M_elems._0_16_ =
                         *(undefined1 (*) [16])(pcVar29->data)._M_elems;
                    uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 4);
                    uVar14 = *(undefined8 *)((pcVar29->data)._M_elems + 6);
                    result_4.m_backend.data._M_elems[4] = (uint)uVar33;
                    result_4.m_backend.data._M_elems[5] = (uint)((ulong)uVar33 >> 0x20);
                    result_4.m_backend.data._M_elems[6] = (uint)uVar14;
                    result_4.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
                    result_4.m_backend.exp = pcVar29->exp;
                    result_4.m_backend.neg = pcVar29->neg;
                    result_4.m_backend.fpclass = pcVar29->fpclass;
                    result_4.m_backend.prec_elem = pcVar29->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&result_4.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar37)
                            );
                }
                auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
                local_758.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
                local_758.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
                local_758.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
                local_758.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
                local_758.data._M_elems._24_5_ =
                     SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],
                                    result_4.m_backend.data._M_elems[6]),0);
                local_758.data._M_elems[7]._1_3_ =
                     (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
                local_758.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
                local_758.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
                local_758.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
                local_758.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
                local_758.exp = result_4.m_backend.exp;
                local_758.neg = result_4.m_backend.neg;
                local_758.fpclass = result_4.m_backend.fpclass;
                local_758.prec_elem = result_4.m_backend.prec_elem;
                result_4.m_backend.data._M_elems._0_16_ = auVar20;
                if (((result_4.m_backend.fpclass == cpp_dec_float_NaN) ||
                    (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
                   (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_758,&degeneps.m_backend), iVar25 < 1)) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                            (&local_758,&local_798);
                  uVar14 = result_4.m_backend._48_8_;
                  if (((local_758.fpclass != cpp_dec_float_NaN) &&
                      (local_568.fpclass != cpp_dec_float_NaN)) &&
                     (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&local_758,&local_568), uVar14 = result_4.m_backend._48_8_,
                     iVar25 < 1)) {
                    result_4.m_backend.data._M_elems[1] = local_798.data._M_elems[1];
                    result_4.m_backend.data._M_elems[0] = local_798.data._M_elems[0];
                    result_4.m_backend.data._M_elems[3] = local_798.data._M_elems[3];
                    result_4.m_backend.data._M_elems[2] = local_798.data._M_elems[2];
                    result_4.m_backend.data._M_elems._32_5_ =
                         SUB85(CONCAT44(local_798.data._M_elems[9],local_798.data._M_elems[8]),0);
                    result_4.m_backend.data._M_elems[9]._1_3_ =
                         (undefined3)(local_798.data._M_elems[9] >> 8);
                    result_4.m_backend.data._M_elems[4] = local_798.data._M_elems[4];
                    result_4.m_backend.data._M_elems[5] = local_798.data._M_elems[5];
                    result_4.m_backend.data._M_elems[6] = local_798.data._M_elems[6];
                    result_4.m_backend.data._M_elems[7] = local_798.data._M_elems[7];
                    result_4.m_backend.exp = local_798.exp;
                    result_4.m_backend.neg = local_798.neg;
                    uVar14._0_4_ = local_798.fpclass;
                    uVar14._4_4_ = local_798.prec_elem;
                    result_4.m_backend.fpclass = local_798.fpclass;
                    result_4.m_backend.prec_elem = local_798.prec_elem;
                    if (local_798.data._M_elems[0] != 0 || local_798.fpclass != cpp_dec_float_finite
                       ) {
                      result_4.m_backend.neg = (bool)(local_798.neg ^ 1);
                    }
                    if (((local_798.fpclass != cpp_dec_float_NaN) &&
                        (uVar14 = result_4.m_backend._48_8_, local_678.fpclass != cpp_dec_float_NaN)
                        ) && (iVar25 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare
                                                 (&result_4.m_backend,&local_678),
                             uVar14 = result_4.m_backend._48_8_, -1 < iVar25)) {
                      iVar25 = (*(this->
                                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._vptr_SPxRatioTester[3])();
                      enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(extraout_var_14,iVar25),uVar4);
                      local_678.neg =
                           (bool)((local_798.data._M_elems[0] != 0 ||
                                  local_798.fpclass != cpp_dec_float_finite) ^ local_798.neg);
                      uVar14 = result_4.m_backend._48_8_;
                      local_79c = uVar4;
                      local_718.data._M_elems._0_8_ = local_758.data._M_elems._0_8_;
                      local_718.data._M_elems._8_8_ = local_758.data._M_elems._8_8_;
                      local_718.data._M_elems._16_8_ = local_758.data._M_elems._16_8_;
                      local_718.data._M_elems._24_5_ = local_758.data._M_elems._24_5_;
                      local_718.data._M_elems[7]._1_3_ = local_758.data._M_elems[7]._1_3_;
                      local_718.data._M_elems._32_5_ = local_758.data._M_elems._32_5_;
                      local_718.data._M_elems[9]._1_3_ = local_758.data._M_elems[9]._1_3_;
                      local_718.exp = local_758.exp;
                      local_718.neg = local_758.neg;
                      local_718._48_8_ = local_758._48_8_;
                      local_678.data._M_elems[0] = local_798.data._M_elems[0];
                      local_678.data._M_elems[1] = local_798.data._M_elems[1];
                      local_678.data._M_elems[2] = local_798.data._M_elems[2];
                      local_678.data._M_elems[3] = local_798.data._M_elems[3];
                      local_678.data._M_elems[4] = local_798.data._M_elems[4];
                      local_678.data._M_elems[5] = local_798.data._M_elems[5];
                      local_678.data._M_elems[6] = local_798.data._M_elems[6];
                      local_678.data._M_elems[7] = local_798.data._M_elems[7];
                      local_678.data._M_elems[8] = local_798.data._M_elems[8];
                      local_678.data._M_elems[9] = local_798.data._M_elems[9];
                      local_678.exp = local_798.exp;
                      local_678._48_8_ = local_798._48_8_;
                    }
                  }
                }
                else {
                  iVar25 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  puVar39 = (undefined1 *)(lVar37 + *plVar6);
                  local_328.fpclass = cpp_dec_float_finite;
                  local_328.prec_elem = 10;
                  local_328.data._M_elems[8] = 0;
                  local_328.data._M_elems[9] = 0;
                  local_328.exp = 0;
                  local_328.neg = false;
                  local_328.data._M_elems[4] = 0;
                  local_328.data._M_elems[5] = 0;
                  local_328.data._M_elems._24_5_ = 0;
                  local_328.data._M_elems[7]._1_3_ = 0;
                  local_328.data._M_elems[0] = 0;
                  local_328.data._M_elems[1] = 0;
                  local_328.data._M_elems[2] = 0;
                  local_328.data._M_elems[3] = 0;
                  if (&local_328 != (cpp_dec_float<50U,_int,_void> *)puVar39) {
                    local_328.data._M_elems._32_8_ = *(undefined8 *)(puVar39 + 0x20);
                    local_328.data._M_elems._0_16_ = *(undefined1 (*) [16])puVar39;
                    local_328.data._M_elems._16_8_ = *(undefined8 *)(puVar39 + 0x10);
                    local_328.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar39 + 0x18),0);
                    local_328.data._M_elems[7]._1_3_ =
                         (undefined3)((ulong)*(undefined8 *)(puVar39 + 0x18) >> 0x28);
                    local_328.exp = *(int *)((long)puVar39 + 0x28);
                    local_328.neg = *(bool *)((long)puVar39 + 0x2c);
                    local_328._48_8_ = *(undefined8 *)((long)puVar39 + 0x30);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (&local_328,&degeneps.m_backend);
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_13,iVar25),uVar4,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_328);
                  uVar14 = result_4.m_backend._48_8_;
                }
              }
            }
            else {
              pcVar29 = (cpp_dec_float<50U,_int,_void> *)(*plVar10 + lVar37);
              result_4.m_backend.fpclass = cpp_dec_float_finite;
              result_4.m_backend.prec_elem = 10;
              result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
              result_4.m_backend.data._M_elems[4] = 0;
              result_4.m_backend.data._M_elems[5] = 0;
              result_4.m_backend.data._M_elems[6] = 0;
              result_4.m_backend.data._M_elems[7] = 0;
              result_4.m_backend.data._M_elems._32_5_ = 0;
              result_4.m_backend.data._M_elems[9]._1_3_ = 0;
              result_4.m_backend.exp = 0;
              result_4.m_backend.neg = false;
              if (&result_4.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar37)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&result_4.m_backend,pcVar29);
                if (result_4.m_backend.data._M_elems[0] != 0 ||
                    result_4.m_backend.fpclass != cpp_dec_float_finite) {
                  result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
                }
              }
              else {
                if (&result_4.m_backend != pcVar29) {
                  uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 8);
                  result_4.m_backend.data._M_elems._32_5_ = SUB85(uVar33,0);
                  result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
                  result_4.m_backend.data._M_elems._0_16_ =
                       *(undefined1 (*) [16])(pcVar29->data)._M_elems;
                  uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 4);
                  uVar14 = *(undefined8 *)((pcVar29->data)._M_elems + 6);
                  result_4.m_backend.data._M_elems[4] = (uint)uVar33;
                  result_4.m_backend.data._M_elems[5] = (uint)((ulong)uVar33 >> 0x20);
                  result_4.m_backend.data._M_elems[6] = (uint)uVar14;
                  result_4.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
                  result_4.m_backend.exp = pcVar29->exp;
                  result_4.m_backend.neg = pcVar29->neg;
                  result_4.m_backend.fpclass = pcVar29->fpclass;
                  result_4.m_backend.prec_elem = pcVar29->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&result_4.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar37));
              }
              local_758.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
              local_758.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
              local_758.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
              local_758.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
              local_758.data._M_elems._24_5_ =
                   SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],
                                  result_4.m_backend.data._M_elems[6]),0);
              local_758.data._M_elems[7]._1_3_ =
                   (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
              local_758.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
              local_758.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
              local_758.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
              local_758.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
              local_758.exp = result_4.m_backend.exp;
              local_758.neg = result_4.m_backend.neg;
              local_758.fpclass = result_4.m_backend.fpclass;
              local_758.prec_elem = result_4.m_backend.prec_elem;
              result_4.m_backend.data._M_elems._32_5_ = degeneps.m_backend.data._M_elems._32_5_;
              result_4.m_backend.data._M_elems[9]._1_3_ = degeneps.m_backend.data._M_elems[9]._1_3_;
              result_4.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
              result_4.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
              result_4.m_backend.data._M_elems[6] = degeneps.m_backend.data._M_elems[6];
              result_4.m_backend.data._M_elems[7] = degeneps.m_backend.data._M_elems[7];
              result_4.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
              result_4.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
              result_4.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              result_4.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
              auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
              result_4.m_backend.exp = degeneps.m_backend.exp;
              result_4.m_backend.neg = degeneps.m_backend.neg;
              uVar15._4_4_ = degeneps.m_backend.prec_elem;
              uVar15._0_4_ = degeneps.m_backend.fpclass;
              result_4.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
              }
              fVar26 = result_4.m_backend.fpclass;
              result_4.m_backend.data._M_elems._0_16_ = auVar20;
              result_4.m_backend._48_8_ = uVar15;
              if ((degeneps.m_backend.fpclass == cpp_dec_float_NaN || fVar26 == cpp_dec_float_NaN)
                 || (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_758,&result_4.m_backend), -1 < iVar25)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                          (&local_758,&local_798);
                uVar14 = result_4.m_backend._48_8_;
                if ((local_758.fpclass != cpp_dec_float_NaN) &&
                   ((((local_568.fpclass != cpp_dec_float_NaN &&
                      (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                compare(&local_758,&local_568), uVar14 = result_4.m_backend._48_8_,
                      iVar25 < 1)) && (local_798.fpclass != cpp_dec_float_NaN)) &&
                    ((local_678.fpclass != cpp_dec_float_NaN &&
                     (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&local_798,&local_678), uVar14 = result_4.m_backend._48_8_,
                     -1 < iVar25)))))) {
                  iVar25 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_11,iVar25),uVar4);
                  local_678.neg = local_798.neg;
                  uVar14 = result_4.m_backend._48_8_;
                  local_79c = uVar4;
                  local_718.data._M_elems._0_8_ = local_758.data._M_elems._0_8_;
                  local_718.data._M_elems._8_8_ = local_758.data._M_elems._8_8_;
                  local_718.data._M_elems._16_8_ = local_758.data._M_elems._16_8_;
                  local_718.data._M_elems._24_5_ = local_758.data._M_elems._24_5_;
                  local_718.data._M_elems[7]._1_3_ = local_758.data._M_elems[7]._1_3_;
                  local_718.data._M_elems._32_5_ = local_758.data._M_elems._32_5_;
                  local_718.data._M_elems[9]._1_3_ = local_758.data._M_elems[9]._1_3_;
                  local_718.exp = local_758.exp;
                  local_718.neg = local_758.neg;
                  local_718._48_8_ = local_758._48_8_;
                  local_678.data._M_elems[0] = local_798.data._M_elems[0];
                  local_678.data._M_elems[1] = local_798.data._M_elems[1];
                  local_678.data._M_elems[2] = local_798.data._M_elems[2];
                  local_678.data._M_elems[3] = local_798.data._M_elems[3];
                  local_678.data._M_elems[4] = local_798.data._M_elems[4];
                  local_678.data._M_elems[5] = local_798.data._M_elems[5];
                  local_678.data._M_elems[6] = local_798.data._M_elems[6];
                  local_678.data._M_elems[7] = local_798.data._M_elems[7];
                  local_678.data._M_elems[8] = local_798.data._M_elems[8];
                  local_678.data._M_elems[9] = local_798.data._M_elems[9];
                  local_678.exp = local_798.exp;
                  local_678._48_8_ = local_798._48_8_;
                }
              }
              else {
                iVar25 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                puVar39 = (undefined1 *)(lVar37 + *plVar6);
                local_2e8.fpclass = cpp_dec_float_finite;
                local_2e8.prec_elem = 10;
                local_2e8.data._M_elems[8] = 0;
                local_2e8.data._M_elems[9] = 0;
                local_2e8.exp = 0;
                local_2e8.neg = false;
                local_2e8.data._M_elems[4] = 0;
                local_2e8.data._M_elems[5] = 0;
                local_2e8.data._M_elems._24_5_ = 0;
                local_2e8.data._M_elems[7]._1_3_ = 0;
                local_2e8.data._M_elems[0] = 0;
                local_2e8.data._M_elems[1] = 0;
                local_2e8.data._M_elems[2] = 0;
                local_2e8.data._M_elems[3] = 0;
                if (&local_2e8 != (cpp_dec_float<50U,_int,_void> *)puVar39) {
                  local_2e8.data._M_elems._32_8_ = *(undefined8 *)(puVar39 + 0x20);
                  local_2e8.data._M_elems._0_16_ = *(undefined1 (*) [16])puVar39;
                  local_2e8.data._M_elems._16_8_ = *(undefined8 *)(puVar39 + 0x10);
                  local_2e8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar39 + 0x18),0);
                  local_2e8.data._M_elems[7]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar39 + 0x18) >> 0x28);
                  local_2e8.exp = *(int *)((long)puVar39 + 0x28);
                  local_2e8.neg = *(bool *)((long)puVar39 + 0x2c);
                  local_2e8._48_8_ = *(undefined8 *)((long)puVar39 + 0x30);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_2e8,&degeneps.m_backend);
                SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_12,iVar25),uVar4,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_2e8);
                uVar14 = result_4.m_backend._48_8_;
              }
            }
            result_4.m_backend._48_8_ = uVar14;
            lVar35 = lVar35 + -1;
          } while (1 < lVar35);
        }
        if (0 < (long)*(int *)(lVar9 + 0x58)) {
          local_690 = 0xffffffff;
          uVar40 = (long)*(int *)(lVar9 + 0x58);
          do {
            lVar35 = *(long *)(lVar9 + 0x70);
            iVar25 = *(int *)(*(long *)(lVar9 + 0x60) + -4 + uVar40 * 4);
            lVar38 = (long)iVar25 * 0x38;
            local_798.exp = *(int *)(lVar35 + 0x28 + lVar38);
            local_798.neg = *(bool *)(lVar35 + 0x2c + lVar38);
            local_798._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
            uVar14 = *(undefined8 *)(lVar35 + lVar38);
            uVar15 = ((undefined8 *)(lVar35 + lVar38))[1];
            puVar1 = (undefined8 *)(lVar35 + 0x10 + lVar38);
            uVar16 = *puVar1;
            uVar17 = puVar1[1];
            uVar33 = *(undefined8 *)(lVar35 + 0x20 + lVar38);
            local_798.data._M_elems[8] = (uint)uVar33;
            local_798.data._M_elems[9] = (uint)((ulong)uVar33 >> 0x20);
            local_798.data._M_elems[4] = (uint)uVar16;
            local_798.data._M_elems[5] = (uint)((ulong)uVar16 >> 0x20);
            local_798.data._M_elems[6] = (uint)uVar17;
            local_798.data._M_elems[7] = (uint)((ulong)uVar17 >> 0x20);
            local_798.data._M_elems[0] = (uint)uVar14;
            local_798.data._M_elems[1] = (uint)((ulong)uVar14 >> 0x20);
            local_798.data._M_elems[2] = (uint)uVar15;
            local_798.data._M_elems[3] = (uint)((ulong)uVar15 >> 0x20);
            if (((local_798.fpclass == cpp_dec_float_NaN) ||
                (local_5a8.fpclass == cpp_dec_float_NaN)) ||
               (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_798,&local_5a8), iVar27 < 1)) {
              result_4.m_backend.data._M_elems[2] = local_5a8.data._M_elems[2];
              result_4.m_backend.data._M_elems[3] = local_5a8.data._M_elems[3];
              result_4.m_backend.data._M_elems[0] = local_5a8.data._M_elems[0];
              result_4.m_backend.data._M_elems[1] = local_5a8.data._M_elems[1];
              auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
              result_4.m_backend.data._M_elems._32_5_ = local_5a8.data._M_elems._32_5_;
              result_4.m_backend.data._M_elems[9]._1_3_ = local_5a8.data._M_elems[9]._1_3_;
              result_4.m_backend.data._M_elems[4] = local_5a8.data._M_elems[4];
              result_4.m_backend.data._M_elems[5] = local_5a8.data._M_elems[5];
              result_4.m_backend.data._M_elems[6] = local_5a8.data._M_elems[6];
              result_4.m_backend.data._M_elems[7] =
                   (uint)(CONCAT35(local_5a8.data._M_elems[7]._1_3_,local_5a8.data._M_elems._24_5_)
                         >> 0x20);
              result_4.m_backend.exp = local_5a8.exp;
              result_4.m_backend.neg = local_5a8.neg;
              result_4.m_backend.fpclass = local_5a8.fpclass;
              result_4.m_backend.prec_elem = local_5a8.prec_elem;
              result_4.m_backend.data._M_elems[0] = local_5a8.data._M_elems[0];
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  local_5a8.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(local_5a8.neg ^ 1);
              }
              result_4.m_backend.data._M_elems._0_16_ = auVar20;
              if (((local_5a8.fpclass == cpp_dec_float_NaN) ||
                  (local_798.fpclass == cpp_dec_float_NaN)) ||
                 (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_798,&result_4.m_backend), -1 < iVar27)) {
                lVar35 = *(long *)(lVar9 + 0x60);
                lVar38 = *(long *)(lVar9 + 0x70);
                lVar37 = (long)*(int *)(lVar35 + -4 + uVar40 * 4) * 0x38;
                *(undefined8 *)(lVar38 + 0x30 + lVar37) = 0xa00000000;
                *(undefined1 (*) [16])(lVar38 + lVar37) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar38 + 0x10 + lVar37) = (undefined1  [16])0x0;
                *(undefined1 (*) [16])(lVar38 + 0x1d + lVar37) = (undefined1  [16])0x0;
                iVar25 = *(int *)(lVar9 + 0x58);
                *(int *)(lVar9 + 0x58) = iVar25 + -1;
                *(undefined4 *)(lVar35 + -4 + uVar40 * 4) =
                     *(undefined4 *)(lVar35 + -4 + (long)iVar25 * 4);
                uVar16 = result_4.m_backend._48_8_;
              }
              else {
                pcVar29 = (cpp_dec_float<50U,_int,_void> *)(*plVar13 + lVar38);
                result_4.m_backend.fpclass = cpp_dec_float_finite;
                result_4.m_backend.prec_elem = 10;
                result_4.m_backend.data._M_elems[0] = 0;
                result_4.m_backend.data._M_elems[1] = 0;
                result_4.m_backend.data._M_elems[2] = 0;
                result_4.m_backend.data._M_elems[3] = 0;
                result_4.m_backend.data._M_elems[4] = 0;
                result_4.m_backend.data._M_elems[5] = 0;
                result_4.m_backend.data._M_elems[6] = 0;
                result_4.m_backend.data._M_elems[7] = 0;
                result_4.m_backend.data._M_elems._32_5_ = 0;
                result_4.m_backend.data._M_elems[9]._1_3_ = 0;
                result_4.m_backend.exp = 0;
                result_4.m_backend.neg = false;
                if (&result_4.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar8 + lVar38)) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&result_4.m_backend,pcVar29);
                  if (result_4.m_backend.data._M_elems[0] != 0 ||
                      result_4.m_backend.fpclass != cpp_dec_float_finite) {
                    result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
                  }
                }
                else {
                  if (&result_4.m_backend != pcVar29) {
                    uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 8);
                    result_4.m_backend.data._M_elems._32_5_ = SUB85(uVar33,0);
                    result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
                    result_4.m_backend.data._M_elems._0_16_ =
                         *(undefined1 (*) [16])(pcVar29->data)._M_elems;
                    uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 4);
                    uVar14 = *(undefined8 *)((pcVar29->data)._M_elems + 6);
                    result_4.m_backend.data._M_elems[4] = (uint)uVar33;
                    result_4.m_backend.data._M_elems[5] = (uint)((ulong)uVar33 >> 0x20);
                    result_4.m_backend.data._M_elems[6] = (uint)uVar14;
                    result_4.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
                    result_4.m_backend.exp = pcVar29->exp;
                    result_4.m_backend.neg = pcVar29->neg;
                    result_4.m_backend.fpclass = pcVar29->fpclass;
                    result_4.m_backend.prec_elem = pcVar29->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&result_4.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar8 + lVar38)
                            );
                }
                auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
                local_758.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
                local_758.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
                local_758.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
                local_758.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
                local_758.data._M_elems._24_5_ =
                     SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],
                                    result_4.m_backend.data._M_elems[6]),0);
                local_758.data._M_elems[7]._1_3_ =
                     (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
                local_758.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
                local_758.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
                local_758.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
                local_758.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
                local_758.exp = result_4.m_backend.exp;
                local_758.neg = result_4.m_backend.neg;
                local_758.fpclass = result_4.m_backend.fpclass;
                local_758.prec_elem = result_4.m_backend.prec_elem;
                result_4.m_backend.data._M_elems._0_16_ = auVar20;
                if (((result_4.m_backend.fpclass == cpp_dec_float_NaN) ||
                    (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
                   (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_758,&degeneps.m_backend), iVar27 < 1)) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                            (&local_758,&local_798);
                  uVar16 = result_4.m_backend._48_8_;
                  if (((local_758.fpclass != cpp_dec_float_NaN) &&
                      (local_568.fpclass != cpp_dec_float_NaN)) &&
                     (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&local_758,&local_568), uVar16 = result_4.m_backend._48_8_,
                     iVar27 < 1)) {
                    result_4.m_backend.data._M_elems[1] = local_798.data._M_elems[1];
                    result_4.m_backend.data._M_elems[0] = local_798.data._M_elems[0];
                    result_4.m_backend.data._M_elems[3] = local_798.data._M_elems[3];
                    result_4.m_backend.data._M_elems[2] = local_798.data._M_elems[2];
                    result_4.m_backend.data._M_elems._32_5_ =
                         SUB85(CONCAT44(local_798.data._M_elems[9],local_798.data._M_elems[8]),0);
                    result_4.m_backend.data._M_elems[9]._1_3_ =
                         (undefined3)(local_798.data._M_elems[9] >> 8);
                    result_4.m_backend.data._M_elems[4] = local_798.data._M_elems[4];
                    result_4.m_backend.data._M_elems[5] = local_798.data._M_elems[5];
                    result_4.m_backend.data._M_elems[6] = local_798.data._M_elems[6];
                    result_4.m_backend.data._M_elems[7] = local_798.data._M_elems[7];
                    result_4.m_backend.exp = local_798.exp;
                    result_4.m_backend.neg = local_798.neg;
                    uVar16._0_4_ = local_798.fpclass;
                    uVar16._4_4_ = local_798.prec_elem;
                    result_4.m_backend.fpclass = local_798.fpclass;
                    result_4.m_backend.prec_elem = local_798.prec_elem;
                    if (local_798.data._M_elems[0] != 0 || local_798.fpclass != cpp_dec_float_finite
                       ) {
                      result_4.m_backend.neg = (bool)(local_798.neg ^ 1);
                    }
                    if (((local_798.fpclass != cpp_dec_float_NaN) &&
                        (uVar16 = result_4.m_backend._48_8_, local_678.fpclass != cpp_dec_float_NaN)
                        ) && (iVar27 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare
                                                 (&result_4.m_backend,&local_678),
                             uVar16 = result_4.m_backend._48_8_, -1 < iVar27)) {
                      iVar27 = (*(this->
                                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._vptr_SPxRatioTester[3])();
                      enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(extraout_var_18,iVar27),iVar25);
                      local_678.neg =
                           (bool)((local_798.data._M_elems[0] != 0 ||
                                  local_798.fpclass != cpp_dec_float_finite) ^ local_798.neg);
                      goto LAB_002aca67;
                    }
                  }
                }
                else {
                  iVar27 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  puVar39 = (undefined1 *)(lVar38 + *plVar8);
                  local_3a8.fpclass = cpp_dec_float_finite;
                  local_3a8.prec_elem = 10;
                  local_3a8.data._M_elems[8] = 0;
                  local_3a8.data._M_elems[9] = 0;
                  local_3a8.exp = 0;
                  local_3a8.neg = false;
                  local_3a8.data._M_elems[4] = 0;
                  local_3a8.data._M_elems[5] = 0;
                  local_3a8.data._M_elems._24_5_ = 0;
                  local_3a8.data._M_elems[7]._1_3_ = 0;
                  local_3a8.data._M_elems[0] = 0;
                  local_3a8.data._M_elems[1] = 0;
                  local_3a8.data._M_elems[2] = 0;
                  local_3a8.data._M_elems[3] = 0;
                  if (&local_3a8 != (cpp_dec_float<50U,_int,_void> *)puVar39) {
                    local_3a8.data._M_elems._32_8_ = *(undefined8 *)(puVar39 + 0x20);
                    local_3a8.data._M_elems._0_16_ = *(undefined1 (*) [16])puVar39;
                    local_3a8.data._M_elems._16_8_ = *(undefined8 *)(puVar39 + 0x10);
                    local_3a8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar39 + 0x18),0);
                    local_3a8.data._M_elems[7]._1_3_ =
                         (undefined3)((ulong)*(undefined8 *)(puVar39 + 0x18) >> 0x28);
                    local_3a8.exp = *(int *)((long)puVar39 + 0x28);
                    local_3a8.neg = *(bool *)((long)puVar39 + 0x2c);
                    local_3a8._48_8_ = *(undefined8 *)((long)puVar39 + 0x30);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (&local_3a8,&degeneps.m_backend);
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::shiftLCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_17,iVar27),iVar25,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_3a8);
                  uVar16 = result_4.m_backend._48_8_;
                }
              }
            }
            else {
              pcVar29 = (cpp_dec_float<50U,_int,_void> *)(*plVar12 + lVar38);
              result_4.m_backend.fpclass = cpp_dec_float_finite;
              result_4.m_backend.prec_elem = 10;
              result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
              result_4.m_backend.data._M_elems[4] = 0;
              result_4.m_backend.data._M_elems[5] = 0;
              result_4.m_backend.data._M_elems[6] = 0;
              result_4.m_backend.data._M_elems[7] = 0;
              result_4.m_backend.data._M_elems._32_5_ = 0;
              result_4.m_backend.data._M_elems[9]._1_3_ = 0;
              result_4.m_backend.exp = 0;
              result_4.m_backend.neg = false;
              if (&result_4.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar8 + lVar38)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&result_4.m_backend,pcVar29);
                if (result_4.m_backend.data._M_elems[0] != 0 ||
                    result_4.m_backend.fpclass != cpp_dec_float_finite) {
                  result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
                }
              }
              else {
                if (&result_4.m_backend != pcVar29) {
                  uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 8);
                  result_4.m_backend.data._M_elems._32_5_ = SUB85(uVar33,0);
                  result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
                  result_4.m_backend.data._M_elems._0_16_ =
                       *(undefined1 (*) [16])(pcVar29->data)._M_elems;
                  uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 4);
                  uVar14 = *(undefined8 *)((pcVar29->data)._M_elems + 6);
                  result_4.m_backend.data._M_elems[4] = (uint)uVar33;
                  result_4.m_backend.data._M_elems[5] = (uint)((ulong)uVar33 >> 0x20);
                  result_4.m_backend.data._M_elems[6] = (uint)uVar14;
                  result_4.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
                  result_4.m_backend.exp = pcVar29->exp;
                  result_4.m_backend.neg = pcVar29->neg;
                  result_4.m_backend.fpclass = pcVar29->fpclass;
                  result_4.m_backend.prec_elem = pcVar29->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&result_4.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar8 + lVar38));
              }
              local_758.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
              local_758.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
              local_758.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
              local_758.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
              local_758.data._M_elems._24_5_ =
                   SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],
                                  result_4.m_backend.data._M_elems[6]),0);
              local_758.data._M_elems[7]._1_3_ =
                   (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
              local_758.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
              local_758.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
              local_758.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
              local_758.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
              local_758.exp = result_4.m_backend.exp;
              local_758.neg = result_4.m_backend.neg;
              local_758.fpclass = result_4.m_backend.fpclass;
              local_758.prec_elem = result_4.m_backend.prec_elem;
              result_4.m_backend.data._M_elems._32_5_ = degeneps.m_backend.data._M_elems._32_5_;
              result_4.m_backend.data._M_elems[9]._1_3_ = degeneps.m_backend.data._M_elems[9]._1_3_;
              result_4.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
              result_4.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
              result_4.m_backend.data._M_elems[6] = degeneps.m_backend.data._M_elems[6];
              result_4.m_backend.data._M_elems[7] = degeneps.m_backend.data._M_elems[7];
              result_4.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
              result_4.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
              result_4.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              result_4.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
              auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
              result_4.m_backend.exp = degeneps.m_backend.exp;
              result_4.m_backend.neg = degeneps.m_backend.neg;
              uVar17._4_4_ = degeneps.m_backend.prec_elem;
              uVar17._0_4_ = degeneps.m_backend.fpclass;
              result_4.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
              }
              fVar26 = result_4.m_backend.fpclass;
              result_4.m_backend.data._M_elems._0_16_ = auVar20;
              result_4.m_backend._48_8_ = uVar17;
              if ((degeneps.m_backend.fpclass == cpp_dec_float_NaN || fVar26 == cpp_dec_float_NaN)
                 || (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_758,&result_4.m_backend), -1 < iVar27)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                          (&local_758,&local_798);
                uVar16 = result_4.m_backend._48_8_;
                if ((((local_758.fpclass != cpp_dec_float_NaN) &&
                     ((local_568.fpclass != cpp_dec_float_NaN &&
                      (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                compare(&local_758,&local_568), uVar16 = result_4.m_backend._48_8_,
                      iVar27 < 1)))) && (local_798.fpclass != cpp_dec_float_NaN)) &&
                   ((local_678.fpclass != cpp_dec_float_NaN &&
                    (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_798,&local_678), uVar16 = result_4.m_backend._48_8_,
                    -1 < iVar27)))) {
                  iVar27 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_15,iVar27),iVar25);
                  local_678.neg = local_798.neg;
LAB_002aca67:
                  local_690 = uVar40 - 1 & 0xffffffff;
                  uVar16 = result_4.m_backend._48_8_;
                  local_718.data._M_elems._0_8_ = local_758.data._M_elems._0_8_;
                  local_718.data._M_elems._8_8_ = local_758.data._M_elems._8_8_;
                  local_718.data._M_elems._16_8_ = local_758.data._M_elems._16_8_;
                  local_718.data._M_elems._24_5_ = local_758.data._M_elems._24_5_;
                  local_718.data._M_elems[7]._1_3_ = local_758.data._M_elems[7]._1_3_;
                  local_718.data._M_elems._32_5_ = local_758.data._M_elems._32_5_;
                  local_718.data._M_elems[9]._1_3_ = local_758.data._M_elems[9]._1_3_;
                  local_718.exp = local_758.exp;
                  local_718.neg = local_758.neg;
                  local_718._48_8_ = local_758._48_8_;
                  local_678.data._M_elems[0] = local_798.data._M_elems[0];
                  local_678.data._M_elems[1] = local_798.data._M_elems[1];
                  local_678.data._M_elems[2] = local_798.data._M_elems[2];
                  local_678.data._M_elems[3] = local_798.data._M_elems[3];
                  local_678.data._M_elems[4] = local_798.data._M_elems[4];
                  local_678.data._M_elems[5] = local_798.data._M_elems[5];
                  local_678.data._M_elems[6] = local_798.data._M_elems[6];
                  local_678.data._M_elems[7] = local_798.data._M_elems[7];
                  local_678.data._M_elems[8] = local_798.data._M_elems[8];
                  local_678.data._M_elems[9] = local_798.data._M_elems[9];
                  local_678.exp = local_798.exp;
                  local_678._48_8_ = local_798._48_8_;
                }
              }
              else {
                iVar27 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                puVar39 = (undefined1 *)(lVar38 + *plVar8);
                local_368.fpclass = cpp_dec_float_finite;
                local_368.prec_elem = 10;
                local_368.data._M_elems[8] = 0;
                local_368.data._M_elems[9] = 0;
                local_368.exp = 0;
                local_368.neg = false;
                local_368.data._M_elems[4] = 0;
                local_368.data._M_elems[5] = 0;
                local_368.data._M_elems._24_5_ = 0;
                local_368.data._M_elems[7]._1_3_ = 0;
                local_368.data._M_elems[0] = 0;
                local_368.data._M_elems[1] = 0;
                local_368.data._M_elems[2] = 0;
                local_368.data._M_elems[3] = 0;
                if (&local_368 != (cpp_dec_float<50U,_int,_void> *)puVar39) {
                  local_368.data._M_elems._32_8_ = *(undefined8 *)(puVar39 + 0x20);
                  local_368.data._M_elems._0_16_ = *(undefined1 (*) [16])puVar39;
                  local_368.data._M_elems._16_8_ = *(undefined8 *)(puVar39 + 0x10);
                  local_368.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar39 + 0x18),0);
                  local_368.data._M_elems[7]._1_3_ =
                       (undefined3)((ulong)*(undefined8 *)(puVar39 + 0x18) >> 0x28);
                  local_368.exp = *(int *)((long)puVar39 + 0x28);
                  local_368.neg = *(bool *)((long)puVar39 + 0x2c);
                  local_368._48_8_ = *(undefined8 *)((long)puVar39 + 0x30);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_368,&degeneps.m_backend);
                SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::shiftUCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_16,iVar27),iVar25,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_368);
                uVar16 = result_4.m_backend._48_8_;
              }
            }
            result_4.m_backend._48_8_ = uVar16;
            bVar24 = 1 < (long)uVar40;
            uVar40 = uVar40 - 1;
          } while (bVar24);
        }
        iVar25 = (*(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar25) + 0x368))
                  (&result_4,(long *)CONCAT44(extraout_var_19,iVar25));
      } while (((local_4a8.fpclass == cpp_dec_float_NaN) ||
               (result_4.m_backend.fpclass == cpp_dec_float_NaN)) ||
              (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_4a8,&result_4.m_backend), iVar25 != 0));
      if (-1 < (int)local_690) {
        iVar25 = (*(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        bVar24 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_20,iVar25),&enterId);
        if (!bVar24) goto LAB_002ad397;
        lVar35 = *(long *)(lVar9 + 0x60);
        lVar38 = *(long *)(lVar9 + 0x70);
        lVar37 = (long)*(int *)(lVar35 + local_690 * 4) * 0x38;
        *(undefined8 *)(lVar38 + 0x30 + lVar37) = 0xa00000000;
        *(undefined1 (*) [16])(lVar38 + lVar37) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(lVar38 + 0x10 + lVar37) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(lVar38 + 0x1d + lVar37) = (undefined1  [16])0x0;
        iVar25 = *(int *)(lVar9 + 0x58);
        *(int *)(lVar9 + 0x58) = iVar25 + -1;
        *(undefined4 *)(lVar35 + local_690 * 4) = *(undefined4 *)(lVar35 + -4 + (long)iVar25 * 4);
        goto LAB_002ab2d5;
      }
      if ((int)local_79c < 0) goto LAB_002af172;
      iVar25 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])();
      lVar35 = *(long *)(CONCAT44(extraout_var_21,iVar25) + 0x790);
      lVar38 = *(long *)(lVar35 + 0x20);
      lVar35 = (long)*(int *)(*(long *)(lVar35 + 0x28) + 4 + (ulong)local_79c * 8);
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 10;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems._32_5_ = 0;
      result_4.m_backend.data._M_elems[9]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      iVar25 = *(int *)(lVar38 + 0xc + lVar35 * 0x28);
      if (0 < iVar25) {
        pcVar29 = *(cpp_dec_float<50U,_int,_void> **)(lVar38 + lVar35 * 0x28);
        iVar25 = iVar25 + 1;
        do {
          pcVar30 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)(int)pcVar29[1].data._M_elems[0] * 0x38 + *plVar8);
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          pcVar36 = pcVar29;
          if ((&result_1.m_backend != pcVar30) &&
             (pcVar36 = pcVar30, pcVar29 != &result_1.m_backend)) {
            uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 8);
            result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar33,0);
            result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
            result_1.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar29->data)._M_elems
            ;
            uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 4);
            uVar14 = *(undefined8 *)((pcVar29->data)._M_elems + 6);
            result_1.m_backend.data._M_elems[4] = (uint)uVar33;
            result_1.m_backend.data._M_elems[5] = (uint)((ulong)uVar33 >> 0x20);
            result_1.m_backend.data._M_elems[6] = (uint)uVar14;
            result_1.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
            result_1.m_backend.exp = pcVar29->exp;
            result_1.m_backend.neg = pcVar29->neg;
            result_1.m_backend.fpclass = pcVar29->fpclass;
            result_1.m_backend.prec_elem = pcVar29->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&result_1.m_backend,pcVar36);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&result_4.m_backend,&result_1.m_backend);
          pcVar29 = (cpp_dec_float<50U,_int,_void> *)(pcVar29[1].data._M_elems + 1);
          iVar25 = iVar25 + -1;
        } while (1 < iVar25);
      }
      result_1.m_backend.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
      result_1.m_backend.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
      uVar33 = result_4.m_backend.data._M_elems._0_8_;
      uVar14 = result_4.m_backend.data._M_elems._8_8_;
      result_1.m_backend.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
      result_1.m_backend.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
      result_1.m_backend.data._M_elems[6] = result_4.m_backend.data._M_elems[6];
      result_1.m_backend.data._M_elems[7] = result_4.m_backend.data._M_elems[7];
      result_1.m_backend.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
      result_1.m_backend.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
      result_1.m_backend.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
      result_1.m_backend.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
      lVar35 = *plVar6;
      lVar38 = (ulong)local_79c * 0x38;
      *(ulong *)(lVar35 + 0x20 + lVar38) =
           CONCAT35(result_4.m_backend.data._M_elems[9]._1_3_,
                    result_4.m_backend.data._M_elems._32_5_);
      puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
      *puVar2 = result_4.m_backend.data._M_elems[4];
      puVar2[1] = result_4.m_backend.data._M_elems[5];
      puVar2[2] = result_4.m_backend.data._M_elems[6];
      puVar2[3] = result_4.m_backend.data._M_elems[7];
      *(undefined8 *)(lVar35 + lVar38) = uVar33;
      *(undefined8 *)((uint *)(lVar35 + lVar38) + 2) = uVar14;
      *(int *)(lVar35 + 0x28 + lVar38) = result_4.m_backend.exp;
      *(bool *)(lVar35 + 0x2c + lVar38) = result_4.m_backend.neg;
      *(undefined8 *)(lVar35 + 0x30 + lVar38) = result_4.m_backend._48_8_;
      iVar25 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])();
      bVar24 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_22,iVar25),&enterId);
      if (bVar24) {
        local_38 = 0xa00000000;
        local_68[0] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[1] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[2] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[3] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[4] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[5] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[6] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[7] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[8] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[9] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[10] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[0xb] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[0xc] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[0xd] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[0xe] = (cpp_dec_float<50u,int,void>)0x0;
        local_68[0xf] = (cpp_dec_float<50u,int,void>)0x0;
        local_58 = SUB1613((undefined1  [16])0x0,0);
        uStack_4b = 0;
        auStack_48 = SUB1613((undefined1  [16])0x0,3);
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(local_68,0.0);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setValue((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)(lVar7 + 0x50),local_79c,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_68);
        goto LAB_002ab2d5;
      }
      lVar35 = *(long *)(lVar7 + 0x70);
      local_798.exp = *(int *)(lVar35 + 0x28 + lVar38);
      local_798.neg = *(bool *)(lVar35 + 0x2c + lVar38);
      local_798._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
      uVar14 = *(undefined8 *)(lVar35 + lVar38);
      uVar15 = ((undefined8 *)(lVar35 + lVar38))[1];
      puVar1 = (undefined8 *)(lVar35 + 0x10 + lVar38);
      uVar16 = *puVar1;
      uVar17 = puVar1[1];
      uVar33 = *(undefined8 *)(lVar35 + 0x20 + lVar38);
      local_798.data._M_elems[8] = (uint)uVar33;
      local_798.data._M_elems[9] = (uint)((ulong)uVar33 >> 0x20);
      local_798.data._M_elems[4] = (uint)uVar16;
      local_798.data._M_elems[5] = (uint)((ulong)uVar16 >> 0x20);
      local_798.data._M_elems[6] = (uint)uVar17;
      local_798.data._M_elems[7] = (uint)((ulong)uVar17 >> 0x20);
      local_798.data._M_elems[0] = (uint)uVar14;
      local_798.data._M_elems[1] = (uint)((ulong)uVar14 >> 0x20);
      local_798.data._M_elems[2] = (uint)uVar15;
      local_798.data._M_elems[3] = (uint)((ulong)uVar15 >> 0x20);
      if (local_798.fpclass == cpp_dec_float_NaN) {
LAB_002ace82:
        pcVar29 = (cpp_dec_float<50U,_int,_void> *)(*plVar11 + lVar38);
        result_4.m_backend.fpclass = cpp_dec_float_finite;
        result_4.m_backend.prec_elem = 10;
        result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems[4] = 0;
        result_4.m_backend.data._M_elems[5] = 0;
        result_4.m_backend.data._M_elems[6] = 0;
        result_4.m_backend.data._M_elems[7] = 0;
        result_4.m_backend.data._M_elems._32_5_ = 0;
        result_4.m_backend.data._M_elems[9]._1_3_ = 0;
        result_4.m_backend.exp = 0;
        result_4.m_backend.neg = false;
        if (&result_4.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar38)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&result_4.m_backend,pcVar29);
          if (result_4.m_backend.data._M_elems[0] != 0 ||
              result_4.m_backend.fpclass != cpp_dec_float_finite) {
            result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
          }
        }
        else {
          if (&result_4.m_backend != pcVar29) {
            uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 8);
            result_4.m_backend.data._M_elems._32_5_ = SUB85(uVar33,0);
            result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
            result_4.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar29->data)._M_elems
            ;
            uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 4);
            uVar14 = *(undefined8 *)((pcVar29->data)._M_elems + 6);
            result_4.m_backend.data._M_elems[4] = (uint)uVar33;
            result_4.m_backend.data._M_elems[5] = (uint)((ulong)uVar33 >> 0x20);
            result_4.m_backend.data._M_elems[6] = (uint)uVar14;
            result_4.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
            result_4.m_backend.exp = pcVar29->exp;
            result_4.m_backend.neg = pcVar29->neg;
            result_4.m_backend.fpclass = pcVar29->fpclass;
            result_4.m_backend.prec_elem = pcVar29->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&result_4.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar38));
        }
        local_718.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
        local_718.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
        local_718.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
        local_718.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
        local_718.data._M_elems._24_5_ =
             SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],result_4.m_backend.data._M_elems[6])
                   ,0);
        local_718.data._M_elems[7]._1_3_ = (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
        local_718.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
        local_718.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
        local_718.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
        local_718.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
        local_718.exp = result_4.m_backend.exp;
        local_718.neg = result_4.m_backend.neg;
        local_718.fpclass = result_4.m_backend.fpclass;
        local_718.prec_elem = result_4.m_backend.prec_elem;
        result_4.m_backend.data._M_elems._32_5_ =
             SUB85(CONCAT44(local_798.data._M_elems[9],local_798.data._M_elems[8]),0);
        result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)(local_798.data._M_elems[9] >> 8);
        result_4.m_backend.data._M_elems[1] = local_798.data._M_elems[1];
        result_4.m_backend.data._M_elems[0] = local_798.data._M_elems[0];
        result_4.m_backend.data._M_elems[3] = local_798.data._M_elems[3];
        result_4.m_backend.data._M_elems[2] = local_798.data._M_elems[2];
        result_4.m_backend.data._M_elems[4] = local_798.data._M_elems[4];
        result_4.m_backend.data._M_elems[5] = local_798.data._M_elems[5];
        result_4.m_backend.data._M_elems[6] = local_798.data._M_elems[6];
        result_4.m_backend.data._M_elems[7] = local_798.data._M_elems[7];
        result_4.m_backend.exp = local_798.exp;
        result_4.m_backend.neg = local_798.neg;
        result_4.m_backend.fpclass = local_798.fpclass;
        result_4.m_backend.prec_elem = local_798.prec_elem;
        if (local_798.data._M_elems[0] != 0 || local_798.fpclass != cpp_dec_float_finite) {
          result_4.m_backend.neg = (bool)(local_798.neg ^ 1);
        }
        if (((local_798.fpclass != cpp_dec_float_NaN) &&
            (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result_4.m_backend,&minStability.m_backend), iVar25 < 0)) {
          result_1.m_backend.data._M_elems[2] = local_718.data._M_elems[2];
          result_1.m_backend.data._M_elems[3] = local_718.data._M_elems[3];
          result_1.m_backend.data._M_elems[0] = local_718.data._M_elems[0];
          result_1.m_backend.data._M_elems[1] = local_718.data._M_elems[1];
          auVar20 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
          result_1.m_backend.data._M_elems._32_5_ = local_718.data._M_elems._32_5_;
          result_1.m_backend.data._M_elems[9]._1_3_ = local_718.data._M_elems[9]._1_3_;
          result_1.m_backend.data._M_elems[4] = local_718.data._M_elems[4];
          result_1.m_backend.data._M_elems[5] = local_718.data._M_elems[5];
          result_1.m_backend.data._M_elems[6] = local_718.data._M_elems[6];
          result_1.m_backend.data._M_elems[7] =
               (uint)(CONCAT35(local_718.data._M_elems[7]._1_3_,local_718.data._M_elems._24_5_) >>
                     0x20);
          result_1.m_backend.exp = local_718.exp;
          result_1.m_backend.neg = local_718.neg;
          result_1.m_backend.fpclass = local_718.fpclass;
          result_1.m_backend.prec_elem = local_718.prec_elem;
          result_1.m_backend.data._M_elems[0] = local_718.data._M_elems[0];
          if (result_1.m_backend.data._M_elems[0] != 0 || local_718.fpclass != cpp_dec_float_finite)
          {
            result_1.m_backend.neg = (bool)(local_718.neg ^ 1);
          }
          result_1.m_backend.data._M_elems._0_16_ = auVar20;
          if (((local_718.fpclass != cpp_dec_float_NaN) &&
              ((this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).delta.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&result_1.m_backend,&pnVar28->m_backend), iVar25 < 0)) {
            result_4.m_backend.fpclass = cpp_dec_float_finite;
            result_4.m_backend.prec_elem = 10;
            result_4.m_backend.data._M_elems[0] = 0;
            result_4.m_backend.data._M_elems[1] = 0;
            result_4.m_backend.data._M_elems[2] = 0;
            result_4.m_backend.data._M_elems[3] = 0;
            result_4.m_backend.data._M_elems[4] = 0;
            result_4.m_backend.data._M_elems[5] = 0;
            result_4.m_backend.data._M_elems[6] = 0;
            result_4.m_backend.data._M_elems[7] = 0;
            result_4.m_backend.data._M_elems._32_5_ = 0;
            result_4.m_backend.data._M_elems[9]._1_3_ = 0;
            result_4.m_backend.exp = 0;
            result_4.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&result_4,2.0);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                      (&minStability.m_backend,&result_4.m_backend);
            iVar25 = (*(this->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxRatioTester[3])();
            lVar35 = *plVar6;
            local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar35 + lVar38);
            local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar35 + lVar38) + 2)
            ;
            puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
            local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar35 + 0x20 + lVar38);
            local_128.m_backend.exp = *(int *)(lVar35 + 0x28 + lVar38);
            local_128.m_backend.neg = *(bool *)(lVar35 + 0x2c + lVar38);
            local_128.m_backend._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_23,iVar25),local_79c,&local_128);
            goto LAB_002ab2d5;
          }
        }
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&result_4.m_backend,0,(type *)0x0);
        iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_798,&result_4.m_backend);
        if (iVar25 < 1) goto LAB_002ace82;
        pcVar29 = (cpp_dec_float<50U,_int,_void> *)(*plVar10 + lVar38);
        result_4.m_backend.fpclass = cpp_dec_float_finite;
        result_4.m_backend.prec_elem = 10;
        result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result_4.m_backend.data._M_elems[4] = 0;
        result_4.m_backend.data._M_elems[5] = 0;
        result_4.m_backend.data._M_elems[6] = 0;
        result_4.m_backend.data._M_elems[7] = 0;
        result_4.m_backend.data._M_elems._32_5_ = 0;
        result_4.m_backend.data._M_elems[9]._1_3_ = 0;
        result_4.m_backend.exp = 0;
        result_4.m_backend.neg = false;
        if (&result_4.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar38)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&result_4.m_backend,pcVar29);
          if (result_4.m_backend.data._M_elems[0] != 0 ||
              result_4.m_backend.fpclass != cpp_dec_float_finite) {
            result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
          }
        }
        else {
          if (&result_4.m_backend != pcVar29) {
            uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 8);
            result_4.m_backend.data._M_elems._32_5_ = SUB85(uVar33,0);
            result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
            result_4.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar29->data)._M_elems
            ;
            uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 4);
            uVar14 = *(undefined8 *)((pcVar29->data)._M_elems + 6);
            result_4.m_backend.data._M_elems[4] = (uint)uVar33;
            result_4.m_backend.data._M_elems[5] = (uint)((ulong)uVar33 >> 0x20);
            result_4.m_backend.data._M_elems[6] = (uint)uVar14;
            result_4.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
            result_4.m_backend.exp = pcVar29->exp;
            result_4.m_backend.neg = pcVar29->neg;
            result_4.m_backend.fpclass = pcVar29->fpclass;
            result_4.m_backend.prec_elem = pcVar29->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&result_4.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar38));
        }
        auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
        local_718.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
        local_718.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
        local_718.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
        local_718.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
        local_718.data._M_elems._24_5_ =
             SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],result_4.m_backend.data._M_elems[6])
                   ,0);
        local_718.data._M_elems[7]._1_3_ = (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
        local_718.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
        local_718.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
        local_718.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
        local_718.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
        local_718.exp = result_4.m_backend.exp;
        local_718.neg = result_4.m_backend.neg;
        local_718.fpclass = result_4.m_backend.fpclass;
        local_718.prec_elem = result_4.m_backend.prec_elem;
        result_4.m_backend.data._M_elems._0_16_ = auVar20;
        if ((((local_798.fpclass != cpp_dec_float_NaN) &&
             (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
            ((iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_798,&minStability.m_backend), iVar25 < 0 &&
             ((local_718.fpclass != cpp_dec_float_NaN &&
              ((this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).delta.m_backend.fpclass != cpp_dec_float_NaN)))))) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_718,&pnVar28->m_backend), iVar25 < 0)) {
          result_4.m_backend.fpclass = cpp_dec_float_finite;
          result_4.m_backend.prec_elem = 10;
          result_4.m_backend.data._M_elems[0] = 0;
          result_4.m_backend.data._M_elems[1] = 0;
          result_4.m_backend.data._M_elems[2] = 0;
          result_4.m_backend.data._M_elems[3] = 0;
          result_4.m_backend.data._M_elems[4] = 0;
          result_4.m_backend.data._M_elems[5] = 0;
          result_4.m_backend.data._M_elems[6] = 0;
          result_4.m_backend.data._M_elems[7] = 0;
          result_4.m_backend.data._M_elems._32_5_ = 0;
          result_4.m_backend.data._M_elems[9]._1_3_ = 0;
          result_4.m_backend.exp = 0;
          result_4.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&result_4,2.0);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                    (&minStability.m_backend,&result_4.m_backend);
          iVar25 = (*(this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SPxRatioTester[3])();
          lVar35 = *plVar6;
          local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar35 + lVar38);
          local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar35 + lVar38) + 2);
          puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
          local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar35 + 0x20 + lVar38);
          local_e8.m_backend.exp = *(int *)(lVar35 + 0x28 + lVar38);
          local_e8.m_backend.neg = *(bool *)(lVar35 + 0x2c + lVar38);
          local_e8.m_backend._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_24,iVar25),local_79c,&local_e8);
          goto LAB_002ab2d5;
        }
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                (&local_718,&local_798);
      if (((local_718.fpclass == cpp_dec_float_NaN) || (local_568.fpclass == cpp_dec_float_NaN)) ||
         (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_718,&local_568), iVar25 < 1)) goto LAB_002ad397;
    } while( true );
  }
  result_4.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
  result_4.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
  result_4.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
  result_4.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
  auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
  result_4.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
  result_4.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
  result_4.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
  result_4.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
  result_4.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
  result_4.m_backend.data._M_elems[7] =
       (uint)(CONCAT35(epsilon.m_backend.data._M_elems[7]._1_3_,
                       epsilon.m_backend.data._M_elems._24_5_) >> 0x20);
  result_4.m_backend.exp = epsilon.m_backend.exp;
  result_4.m_backend.neg = epsilon.m_backend.neg;
  result_4.m_backend.fpclass = epsilon.m_backend.fpclass;
  result_4.m_backend.prec_elem = epsilon.m_backend.prec_elem;
  result_4.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
  if (result_4.m_backend.data._M_elems[0] != 0 || epsilon.m_backend.fpclass != cpp_dec_float_finite)
  {
    result_4.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
  }
  if (((epsilon.m_backend.fpclass == cpp_dec_float_NaN) ||
      ((val->m_backend).fpclass == cpp_dec_float_NaN)) ||
     (result_4.m_backend.data._M_elems._0_16_ = auVar20,
     iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&val->m_backend,&result_4.m_backend), -1 < iVar25)) {
LAB_002ad397:
    *(ulong *)((val->m_backend).data._M_elems + 8) =
         CONCAT35(local_718.data._M_elems[9]._1_3_,local_718.data._M_elems._32_5_);
    *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_718.data._M_elems._16_8_;
    *(ulong *)((val->m_backend).data._M_elems + 6) =
         CONCAT35(local_718.data._M_elems[7]._1_3_,local_718.data._M_elems._24_5_);
    *(undefined8 *)(val->m_backend).data._M_elems = local_718.data._M_elems._0_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_718.data._M_elems._8_8_;
    (val->m_backend).exp = local_718.exp;
    (val->m_backend).neg = local_718.neg;
    (val->m_backend).fpclass = local_718.fpclass;
    (val->m_backend).prec_elem = local_718.prec_elem;
    return (SPxId)enterId.super_DataKey;
  }
  dVar3 = *(double *)(in_FS_OFFSET + -8);
  pnVar28 = &(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).delta;
LAB_002ad428:
  do {
    do {
      uVar33 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
      local_568.data._M_elems._32_5_ = SUB85(uVar33,0);
      local_568.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
      local_568.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
      local_568.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
      local_568.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
      local_568.data._M_elems[6] = (val->m_backend).data._M_elems[6];
      local_568.data._M_elems[7] = (val->m_backend).data._M_elems[7];
      local_568.exp = (val->m_backend).exp;
      local_568.neg = (val->m_backend).neg;
      local_568.fpclass = (val->m_backend).fpclass;
      local_568.prec_elem = (val->m_backend).prec_elem;
      iVar25 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar25) + 0x368))
                (&result_4,(long *)CONCAT44(extraout_var_25,iVar25));
      auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
      local_4a8.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
      local_4a8.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
      local_4a8.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
      local_4a8.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
      local_4a8.data._M_elems._24_5_ =
           SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],result_4.m_backend.data._M_elems[6]),0
                );
      local_4a8.data._M_elems[7]._1_3_ = (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
      local_4a8.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
      local_4a8.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
      local_4a8.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
      local_4a8.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
      local_4a8.exp = result_4.m_backend.exp;
      local_4a8.neg = result_4.m_backend.neg;
      local_4a8.fpclass = result_4.m_backend.fpclass;
      local_4a8.prec_elem = result_4.m_backend.prec_elem;
      result_4.m_backend.data._M_elems._0_16_ = auVar20;
      minDelta(this,&rmaxabs,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_568,*(int *)(lVar7 + 0x58),*(int **)(lVar7 + 0x60),
               *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 **)(lVar7 + 0x70),
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar6,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar11,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar10);
      minDelta(this,&cmaxabs,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_568,*(int *)(lVar9 + 0x58),*(int **)(lVar9 + 0x60),
               *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 **)(lVar9 + 0x70),
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar8,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar13,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar12);
      if (((local_568.fpclass != cpp_dec_float_NaN) &&
          ((val->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_568,&val->m_backend), iVar25 == 0)) {
        uVar31._0_4_ = enterId.super_DataKey.info;
        uVar31._4_4_ = enterId.super_DataKey.idx;
        return (SPxId)uVar31;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_678,0);
      ::soplex::infinity::__tls_init();
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 10;
      result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems._32_5_ = 0;
      result_4.m_backend.data._M_elems[9]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result_4,dVar3);
      auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
      local_718.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
      local_718.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
      local_718.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
      local_718.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
      local_718.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
      local_718.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
      local_718.data._M_elems._24_5_ =
           SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],result_4.m_backend.data._M_elems[6]),0
                );
      local_718.data._M_elems[7]._1_3_ = (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
      local_718.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
      local_718.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
      local_718.exp = result_4.m_backend.exp;
      local_718.neg = result_4.m_backend.neg;
      local_718.fpclass = result_4.m_backend.fpclass;
      local_718.prec_elem = result_4.m_backend.prec_elem;
      result.m_backend.data._M_elems._32_5_ = rmaxabs.m_backend.data._M_elems._32_5_;
      result.m_backend.data._M_elems[9]._1_3_ = rmaxabs.m_backend.data._M_elems[9]._1_3_;
      result.m_backend.data._M_elems[4] = rmaxabs.m_backend.data._M_elems[4];
      result.m_backend.data._M_elems[5] = rmaxabs.m_backend.data._M_elems[5];
      result.m_backend.data._M_elems._24_5_ = rmaxabs.m_backend.data._M_elems._24_5_;
      result.m_backend.data._M_elems[7]._1_3_ = rmaxabs.m_backend.data._M_elems[7]._1_3_;
      result.m_backend.data._M_elems[0] = rmaxabs.m_backend.data._M_elems[0];
      result.m_backend.data._M_elems[1] = rmaxabs.m_backend.data._M_elems[1];
      result.m_backend.data._M_elems[2] = rmaxabs.m_backend.data._M_elems[2];
      result.m_backend.data._M_elems[3] = rmaxabs.m_backend.data._M_elems[3];
      result.m_backend.exp = rmaxabs.m_backend.exp;
      result.m_backend.neg = rmaxabs.m_backend.neg;
      result.m_backend.fpclass = rmaxabs.m_backend.fpclass;
      result.m_backend.prec_elem = rmaxabs.m_backend.prec_elem;
      result_4.m_backend.data._M_elems._0_16_ = auVar20;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result.m_backend,&epsilon.m_backend);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend.data._M_elems[9]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 10;
      result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems._32_5_ = 0;
      result_4.m_backend.data._M_elems[9]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result_4,0.001);
      result_1.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      result_1.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      result_1.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      result_1.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      result_1.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      result_1.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      result_1.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
      result_1.m_backend.data._M_elems[7] =
           (uint)(CONCAT35(result.m_backend.data._M_elems[7]._1_3_,
                           result.m_backend.data._M_elems._24_5_) >> 0x20);
      result_1.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
      result_1.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
      result_1.m_backend.exp = result.m_backend.exp;
      result_1.m_backend.neg = result.m_backend.neg;
      result_1.m_backend.fpclass = result.m_backend.fpclass;
      result_1.m_backend.prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result_1.m_backend,&result_4.m_backend);
      local_5e8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
      local_5e8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
      local_5e8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
      local_5e8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
      local_5e8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
      local_5e8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
      local_5e8.data._M_elems._24_5_ =
           SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],result_1.m_backend.data._M_elems[6]),0
                );
      local_5e8.data._M_elems[7]._1_3_ = (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
      local_5e8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
      local_5e8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
      local_5e8.exp = result_1.m_backend.exp;
      local_5e8.neg = result_1.m_backend.neg;
      local_5e8.fpclass = result_1.m_backend.fpclass;
      local_5e8.prec_elem = result_1.m_backend.prec_elem;
      result.m_backend.data._M_elems._32_5_ = cmaxabs.m_backend.data._M_elems._32_5_;
      result.m_backend.data._M_elems[9]._1_3_ = cmaxabs.m_backend.data._M_elems[9]._1_3_;
      result.m_backend.data._M_elems[4] = cmaxabs.m_backend.data._M_elems[4];
      result.m_backend.data._M_elems[5] = cmaxabs.m_backend.data._M_elems[5];
      result.m_backend.data._M_elems._24_5_ = cmaxabs.m_backend.data._M_elems._24_5_;
      result.m_backend.data._M_elems[7]._1_3_ = cmaxabs.m_backend.data._M_elems[7]._1_3_;
      result.m_backend.data._M_elems[0] = cmaxabs.m_backend.data._M_elems[0];
      result.m_backend.data._M_elems[1] = cmaxabs.m_backend.data._M_elems[1];
      result.m_backend.data._M_elems[2] = cmaxabs.m_backend.data._M_elems[2];
      result.m_backend.data._M_elems[3] = cmaxabs.m_backend.data._M_elems[3];
      result.m_backend.exp = cmaxabs.m_backend.exp;
      result.m_backend.neg = cmaxabs.m_backend.neg;
      result.m_backend.fpclass = cmaxabs.m_backend.fpclass;
      result.m_backend.prec_elem = cmaxabs.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result.m_backend,&epsilon.m_backend);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend.data._M_elems[9]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 10;
      result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems._32_5_ = 0;
      result_4.m_backend.data._M_elems[9]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result_4,0.001);
      result_1.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      result_1.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      result_1.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      result_1.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      result_1.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      result_1.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      result_1.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
      result_1.m_backend.data._M_elems[7] =
           (uint)(CONCAT35(result.m_backend.data._M_elems[7]._1_3_,
                           result.m_backend.data._M_elems._24_5_) >> 0x20);
      result_1.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
      result_1.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
      result_1.m_backend.exp = result.m_backend.exp;
      result_1.m_backend.neg = result.m_backend.neg;
      result_1.m_backend.fpclass = result.m_backend.fpclass;
      result_1.m_backend.prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result_1.m_backend,&result_4.m_backend);
      auVar20 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
      local_5a8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
      local_5a8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
      local_5a8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
      local_5a8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
      local_5a8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
      local_5a8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
      local_5a8.data._M_elems._24_5_ =
           SUB85(CONCAT44(result_1.m_backend.data._M_elems[7],result_1.m_backend.data._M_elems[6]),0
                );
      local_5a8.data._M_elems[7]._1_3_ = (undefined3)(result_1.m_backend.data._M_elems[7] >> 8);
      local_5a8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
      local_5a8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
      local_5a8.exp = result_1.m_backend.exp;
      local_5a8.neg = result_1.m_backend.neg;
      local_5a8.fpclass = result_1.m_backend.fpclass;
      local_5a8.prec_elem = result_1.m_backend.prec_elem;
      local_690 = 0xffffffff;
      local_79c = 0xffffffff;
      result_1.m_backend.data._M_elems._0_16_ = auVar20;
      if (0 < (long)*(int *)(lVar7 + 0x58)) {
        lVar35 = (long)*(int *)(lVar7 + 0x58) + 1;
        local_79c = 0xffffffff;
        do {
          lVar38 = *(long *)(lVar7 + 0x70);
          uVar4 = *(uint *)(*(long *)(lVar7 + 0x60) + -8 + lVar35 * 4);
          lVar37 = (long)(int)uVar4 * 0x38;
          local_798.exp = *(int *)(lVar38 + 0x28 + lVar37);
          local_798.neg = *(bool *)(lVar38 + 0x2c + lVar37);
          local_798._48_8_ = *(undefined8 *)(lVar38 + 0x30 + lVar37);
          uVar14 = *(undefined8 *)(lVar38 + lVar37);
          uVar15 = ((undefined8 *)(lVar38 + lVar37))[1];
          puVar1 = (undefined8 *)(lVar38 + 0x10 + lVar37);
          uVar16 = *puVar1;
          uVar17 = puVar1[1];
          uVar33 = *(undefined8 *)(lVar38 + 0x20 + lVar37);
          local_798.data._M_elems[8] = (uint)uVar33;
          local_798.data._M_elems[9] = (uint)((ulong)uVar33 >> 0x20);
          local_798.data._M_elems[4] = (uint)uVar16;
          local_798.data._M_elems[5] = (uint)((ulong)uVar16 >> 0x20);
          local_798.data._M_elems[6] = (uint)uVar17;
          local_798.data._M_elems[7] = (uint)((ulong)uVar17 >> 0x20);
          local_798.data._M_elems[0] = (uint)uVar14;
          local_798.data._M_elems[1] = (uint)((ulong)uVar14 >> 0x20);
          local_798.data._M_elems[2] = (uint)uVar15;
          local_798.data._M_elems[3] = (uint)((ulong)uVar15 >> 0x20);
          if (((local_798.fpclass == cpp_dec_float_NaN) || (local_5e8.fpclass == cpp_dec_float_NaN))
             || (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_798,&local_5e8), iVar25 < 1)) {
            result_4.m_backend.data._M_elems[2] = local_5e8.data._M_elems[2];
            result_4.m_backend.data._M_elems[3] = local_5e8.data._M_elems[3];
            result_4.m_backend.data._M_elems[0] = local_5e8.data._M_elems[0];
            result_4.m_backend.data._M_elems[1] = local_5e8.data._M_elems[1];
            auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
            result_4.m_backend.data._M_elems._32_5_ = local_5e8.data._M_elems._32_5_;
            result_4.m_backend.data._M_elems[9]._1_3_ = local_5e8.data._M_elems[9]._1_3_;
            result_4.m_backend.data._M_elems[4] = local_5e8.data._M_elems[4];
            result_4.m_backend.data._M_elems[5] = local_5e8.data._M_elems[5];
            result_4.m_backend.data._M_elems[6] = local_5e8.data._M_elems[6];
            result_4.m_backend.data._M_elems[7] =
                 (uint)(CONCAT35(local_5e8.data._M_elems[7]._1_3_,local_5e8.data._M_elems._24_5_) >>
                       0x20);
            result_4.m_backend.exp = local_5e8.exp;
            result_4.m_backend.neg = local_5e8.neg;
            result_4.m_backend.fpclass = local_5e8.fpclass;
            result_4.m_backend.prec_elem = local_5e8.prec_elem;
            result_4.m_backend.data._M_elems[0] = local_5e8.data._M_elems[0];
            if (result_4.m_backend.data._M_elems[0] != 0 ||
                local_5e8.fpclass != cpp_dec_float_finite) {
              result_4.m_backend.neg = (bool)(local_5e8.neg ^ 1);
            }
            result_4.m_backend.data._M_elems._0_16_ = auVar20;
            if (((local_5e8.fpclass == cpp_dec_float_NaN) ||
                (local_798.fpclass == cpp_dec_float_NaN)) ||
               (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_798,&result_4.m_backend), -1 < iVar25)) {
              lVar38 = *(long *)(lVar7 + 0x60);
              lVar37 = *(long *)(lVar7 + 0x70);
              lVar34 = (long)*(int *)(lVar38 + -8 + lVar35 * 4) * 0x38;
              *(undefined8 *)(lVar37 + 0x30 + lVar34) = 0xa00000000;
              *(undefined1 (*) [16])(lVar37 + lVar34) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar37 + 0x10 + lVar34) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar37 + 0x1d + lVar34) = (undefined1  [16])0x0;
              iVar25 = *(int *)(lVar7 + 0x58);
              *(int *)(lVar7 + 0x58) = iVar25 + -1;
              *(undefined4 *)(lVar38 + -8 + lVar35 * 4) =
                   *(undefined4 *)(lVar38 + -4 + (long)iVar25 * 4);
              uVar23 = result_4.m_backend._48_8_;
            }
            else {
              pcVar29 = (cpp_dec_float<50U,_int,_void> *)(*plVar10 + lVar37);
              result_4.m_backend.fpclass = cpp_dec_float_finite;
              result_4.m_backend.prec_elem = 10;
              result_4.m_backend.data._M_elems[0] = 0;
              result_4.m_backend.data._M_elems[1] = 0;
              result_4.m_backend.data._M_elems[2] = 0;
              result_4.m_backend.data._M_elems[3] = 0;
              result_4.m_backend.data._M_elems[4] = 0;
              result_4.m_backend.data._M_elems[5] = 0;
              result_4.m_backend.data._M_elems[6] = 0;
              result_4.m_backend.data._M_elems[7] = 0;
              result_4.m_backend.data._M_elems._32_5_ = 0;
              result_4.m_backend.data._M_elems[9]._1_3_ = 0;
              result_4.m_backend.exp = 0;
              result_4.m_backend.neg = false;
              if (&result_4.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar37)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&result_4.m_backend,pcVar29);
                if (result_4.m_backend.data._M_elems[0] != 0 ||
                    result_4.m_backend.fpclass != cpp_dec_float_finite) {
                  result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
                }
              }
              else {
                if (&result_4.m_backend != pcVar29) {
                  uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 8);
                  result_4.m_backend.data._M_elems._32_5_ = SUB85(uVar33,0);
                  result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
                  result_4.m_backend.data._M_elems._0_16_ =
                       *(undefined1 (*) [16])(pcVar29->data)._M_elems;
                  uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 4);
                  uVar14 = *(undefined8 *)((pcVar29->data)._M_elems + 6);
                  result_4.m_backend.data._M_elems[4] = (uint)uVar33;
                  result_4.m_backend.data._M_elems[5] = (uint)((ulong)uVar33 >> 0x20);
                  result_4.m_backend.data._M_elems[6] = (uint)uVar14;
                  result_4.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
                  result_4.m_backend.exp = pcVar29->exp;
                  result_4.m_backend.neg = pcVar29->neg;
                  result_4.m_backend.fpclass = pcVar29->fpclass;
                  result_4.m_backend.prec_elem = pcVar29->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&result_4.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar37));
              }
              local_758.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
              local_758.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
              local_758.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
              local_758.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
              local_758.data._M_elems._24_5_ =
                   SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],
                                  result_4.m_backend.data._M_elems[6]),0);
              local_758.data._M_elems[7]._1_3_ =
                   (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
              local_758.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
              local_758.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
              local_758.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
              local_758.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
              local_758.exp = result_4.m_backend.exp;
              local_758.neg = result_4.m_backend.neg;
              local_758.fpclass = result_4.m_backend.fpclass;
              local_758.prec_elem = result_4.m_backend.prec_elem;
              result_4.m_backend.data._M_elems._32_5_ = degeneps.m_backend.data._M_elems._32_5_;
              result_4.m_backend.data._M_elems[9]._1_3_ = degeneps.m_backend.data._M_elems[9]._1_3_;
              result_4.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
              result_4.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
              result_4.m_backend.data._M_elems[6] = degeneps.m_backend.data._M_elems[6];
              result_4.m_backend.data._M_elems[7] = degeneps.m_backend.data._M_elems[7];
              result_4.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
              result_4.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
              result_4.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              result_4.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
              auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
              result_4.m_backend.exp = degeneps.m_backend.exp;
              result_4.m_backend.neg = degeneps.m_backend.neg;
              uVar18._4_4_ = degeneps.m_backend.prec_elem;
              uVar18._0_4_ = degeneps.m_backend.fpclass;
              result_4.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
              }
              fVar26 = result_4.m_backend.fpclass;
              result_4.m_backend.data._M_elems._0_16_ = auVar20;
              result_4.m_backend._48_8_ = uVar18;
              if ((degeneps.m_backend.fpclass == cpp_dec_float_NaN || fVar26 == cpp_dec_float_NaN)
                 || (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_758,&result_4.m_backend), -1 < iVar25)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                          (&local_758,&local_798);
                uVar23 = result_4.m_backend._48_8_;
                if ((local_758.fpclass != cpp_dec_float_NaN) &&
                   ((local_568.fpclass != cpp_dec_float_NaN &&
                    (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_758,&local_568), uVar23 = result_4.m_backend._48_8_,
                    -1 < iVar25)))) {
                  result_4.m_backend.data._M_elems[1] = local_798.data._M_elems[1];
                  result_4.m_backend.data._M_elems[0] = local_798.data._M_elems[0];
                  result_4.m_backend.data._M_elems[3] = local_798.data._M_elems[3];
                  result_4.m_backend.data._M_elems[2] = local_798.data._M_elems[2];
                  result_4.m_backend.data._M_elems._32_5_ =
                       SUB85(CONCAT44(local_798.data._M_elems[9],local_798.data._M_elems[8]),0);
                  result_4.m_backend.data._M_elems[9]._1_3_ =
                       (undefined3)(local_798.data._M_elems[9] >> 8);
                  result_4.m_backend.data._M_elems[4] = local_798.data._M_elems[4];
                  result_4.m_backend.data._M_elems[5] = local_798.data._M_elems[5];
                  result_4.m_backend.data._M_elems[6] = local_798.data._M_elems[6];
                  result_4.m_backend.data._M_elems[7] = local_798.data._M_elems[7];
                  result_4.m_backend.exp = local_798.exp;
                  result_4.m_backend.neg = local_798.neg;
                  uVar23._0_4_ = local_798.fpclass;
                  uVar23._4_4_ = local_798.prec_elem;
                  result_4.m_backend.fpclass = local_798.fpclass;
                  result_4.m_backend.prec_elem = local_798.prec_elem;
                  if (local_798.data._M_elems[0] != 0 || local_798.fpclass != cpp_dec_float_finite)
                  {
                    result_4.m_backend.neg = (bool)(local_798.neg ^ 1);
                  }
                  if (((local_798.fpclass != cpp_dec_float_NaN) &&
                      (uVar23 = result_4.m_backend._48_8_, local_678.fpclass != cpp_dec_float_NaN))
                     && (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  compare(&result_4.m_backend,&local_678),
                        uVar23 = result_4.m_backend._48_8_, 0 < iVar25)) {
                    iVar25 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_28,iVar25),uVar4);
                    local_678.neg =
                         (bool)((local_798.data._M_elems[0] != 0 ||
                                local_798.fpclass != cpp_dec_float_finite) ^ local_798.neg);
                    uVar23 = result_4.m_backend._48_8_;
                    local_79c = uVar4;
                    local_718.data._M_elems._0_8_ = local_758.data._M_elems._0_8_;
                    local_718.data._M_elems._8_8_ = local_758.data._M_elems._8_8_;
                    local_718.data._M_elems._16_8_ = local_758.data._M_elems._16_8_;
                    local_718.data._M_elems._24_5_ = local_758.data._M_elems._24_5_;
                    local_718.data._M_elems[7]._1_3_ = local_758.data._M_elems[7]._1_3_;
                    local_718.data._M_elems._32_5_ = local_758.data._M_elems._32_5_;
                    local_718.data._M_elems[9]._1_3_ = local_758.data._M_elems[9]._1_3_;
                    local_718.exp = local_758.exp;
                    local_718.neg = local_758.neg;
                    local_718._48_8_ = local_758._48_8_;
                    local_678.data._M_elems[0] = local_798.data._M_elems[0];
                    local_678.data._M_elems[1] = local_798.data._M_elems[1];
                    local_678.data._M_elems[2] = local_798.data._M_elems[2];
                    local_678.data._M_elems[3] = local_798.data._M_elems[3];
                    local_678.data._M_elems[4] = local_798.data._M_elems[4];
                    local_678.data._M_elems[5] = local_798.data._M_elems[5];
                    local_678.data._M_elems[6] = local_798.data._M_elems[6];
                    local_678.data._M_elems[7] = local_798.data._M_elems[7];
                    local_678.data._M_elems[8] = local_798.data._M_elems[8];
                    local_678.data._M_elems[9] = local_798.data._M_elems[9];
                    local_678.exp = local_798.exp;
                    local_678._48_8_ = local_798._48_8_;
                  }
                }
              }
              else {
                iVar25 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                lVar38 = *plVar6;
                local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar38 + lVar37);
                local_1a8.m_backend.data._M_elems._8_8_ =
                     *(undefined8 *)((uint *)(lVar38 + lVar37) + 2);
                puVar2 = (uint *)(lVar38 + 0x10 + lVar37);
                local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
                local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar38 + 0x20 + lVar37);
                local_1a8.m_backend.exp = *(int *)(lVar38 + 0x28 + lVar37);
                local_1a8.m_backend.neg = *(bool *)(lVar38 + 0x2c + lVar37);
                local_1a8.m_backend._48_8_ = *(undefined8 *)(lVar38 + 0x30 + lVar37);
                SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_29,iVar25),uVar4,&local_1a8);
                uVar23 = result_4.m_backend._48_8_;
              }
            }
          }
          else {
            pcVar29 = (cpp_dec_float<50U,_int,_void> *)(*plVar11 + lVar37);
            result_4.m_backend.fpclass = cpp_dec_float_finite;
            result_4.m_backend.prec_elem = 10;
            result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
            result_4.m_backend.data._M_elems[4] = 0;
            result_4.m_backend.data._M_elems[5] = 0;
            result_4.m_backend.data._M_elems[6] = 0;
            result_4.m_backend.data._M_elems[7] = 0;
            result_4.m_backend.data._M_elems._32_5_ = 0;
            result_4.m_backend.data._M_elems[9]._1_3_ = 0;
            result_4.m_backend.exp = 0;
            result_4.m_backend.neg = false;
            if (&result_4.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar37)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&result_4.m_backend,pcVar29);
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  result_4.m_backend.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
              }
            }
            else {
              if (&result_4.m_backend != pcVar29) {
                uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 8);
                result_4.m_backend.data._M_elems._32_5_ = SUB85(uVar33,0);
                result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
                result_4.m_backend.data._M_elems._0_16_ =
                     *(undefined1 (*) [16])(pcVar29->data)._M_elems;
                uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 4);
                uVar14 = *(undefined8 *)((pcVar29->data)._M_elems + 6);
                result_4.m_backend.data._M_elems[4] = (uint)uVar33;
                result_4.m_backend.data._M_elems[5] = (uint)((ulong)uVar33 >> 0x20);
                result_4.m_backend.data._M_elems[6] = (uint)uVar14;
                result_4.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
                result_4.m_backend.exp = pcVar29->exp;
                result_4.m_backend.neg = pcVar29->neg;
                result_4.m_backend.fpclass = pcVar29->fpclass;
                result_4.m_backend.prec_elem = pcVar29->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&result_4.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar37));
            }
            auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
            local_758.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
            local_758.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
            local_758.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
            local_758.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
            local_758.data._M_elems._24_5_ =
                 SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],
                                result_4.m_backend.data._M_elems[6]),0);
            local_758.data._M_elems[7]._1_3_ =
                 (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
            local_758.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
            local_758.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
            local_758.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
            local_758.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
            local_758.exp = result_4.m_backend.exp;
            local_758.neg = result_4.m_backend.neg;
            local_758.fpclass = result_4.m_backend.fpclass;
            local_758.prec_elem = result_4.m_backend.prec_elem;
            result_4.m_backend.data._M_elems._0_16_ = auVar20;
            if (((result_4.m_backend.fpclass == cpp_dec_float_NaN) ||
                (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
               (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_758,&degeneps.m_backend), iVar25 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                        (&local_758,&local_798);
              uVar23 = result_4.m_backend._48_8_;
              if (((local_758.fpclass != cpp_dec_float_NaN) &&
                  (local_568.fpclass != cpp_dec_float_NaN)) &&
                 ((iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                      (&local_758,&local_568), uVar23 = result_4.m_backend._48_8_,
                  -1 < iVar25 &&
                  (((local_798.fpclass != cpp_dec_float_NaN &&
                    (local_678.fpclass != cpp_dec_float_NaN)) &&
                   (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_798,&local_678), uVar23 = result_4.m_backend._48_8_,
                   0 < iVar25)))))) {
                iVar25 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_27,iVar25),uVar4);
                local_678.neg = local_798.neg;
                uVar23 = result_4.m_backend._48_8_;
                local_79c = uVar4;
                local_718.data._M_elems._0_8_ = local_758.data._M_elems._0_8_;
                local_718.data._M_elems._8_8_ = local_758.data._M_elems._8_8_;
                local_718.data._M_elems._16_8_ = local_758.data._M_elems._16_8_;
                local_718.data._M_elems._24_5_ = local_758.data._M_elems._24_5_;
                local_718.data._M_elems[7]._1_3_ = local_758.data._M_elems[7]._1_3_;
                local_718.data._M_elems._32_5_ = local_758.data._M_elems._32_5_;
                local_718.data._M_elems[9]._1_3_ = local_758.data._M_elems[9]._1_3_;
                local_718.exp = local_758.exp;
                local_718.neg = local_758.neg;
                local_718._48_8_ = local_758._48_8_;
                local_678.data._M_elems[0] = local_798.data._M_elems[0];
                local_678.data._M_elems[1] = local_798.data._M_elems[1];
                local_678.data._M_elems[2] = local_798.data._M_elems[2];
                local_678.data._M_elems[3] = local_798.data._M_elems[3];
                local_678.data._M_elems[4] = local_798.data._M_elems[4];
                local_678.data._M_elems[5] = local_798.data._M_elems[5];
                local_678.data._M_elems[6] = local_798.data._M_elems[6];
                local_678.data._M_elems[7] = local_798.data._M_elems[7];
                local_678.data._M_elems[8] = local_798.data._M_elems[8];
                local_678.data._M_elems[9] = local_798.data._M_elems[9];
                local_678.exp = local_798.exp;
                local_678._48_8_ = local_798._48_8_;
              }
            }
            else {
              iVar25 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              lVar38 = *plVar6;
              local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar38 + lVar37);
              local_168.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((uint *)(lVar38 + lVar37) + 2);
              puVar2 = (uint *)(lVar38 + 0x10 + lVar37);
              local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_168.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar38 + 0x20 + lVar37);
              local_168.m_backend.exp = *(int *)(lVar38 + 0x28 + lVar37);
              local_168.m_backend.neg = *(bool *)(lVar38 + 0x2c + lVar37);
              local_168.m_backend._48_8_ = *(undefined8 *)(lVar38 + 0x30 + lVar37);
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_26,iVar25),uVar4,&local_168);
              uVar23 = result_4.m_backend._48_8_;
            }
          }
          result_4.m_backend._48_8_ = uVar23;
          lVar35 = lVar35 + -1;
        } while (1 < lVar35);
      }
      if (0 < (long)*(int *)(lVar9 + 0x58)) {
        local_690 = 0xffffffff;
        uVar40 = (long)*(int *)(lVar9 + 0x58);
        do {
          lVar35 = *(long *)(lVar9 + 0x70);
          iVar25 = *(int *)(*(long *)(lVar9 + 0x60) + -4 + uVar40 * 4);
          lVar38 = (long)iVar25 * 0x38;
          local_798.exp = *(int *)(lVar35 + 0x28 + lVar38);
          local_798.neg = *(bool *)(lVar35 + 0x2c + lVar38);
          local_798._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
          uVar14 = *(undefined8 *)(lVar35 + lVar38);
          uVar15 = ((undefined8 *)(lVar35 + lVar38))[1];
          puVar1 = (undefined8 *)(lVar35 + 0x10 + lVar38);
          uVar16 = *puVar1;
          uVar17 = puVar1[1];
          uVar33 = *(undefined8 *)(lVar35 + 0x20 + lVar38);
          local_798.data._M_elems[8] = (uint)uVar33;
          local_798.data._M_elems[9] = (uint)((ulong)uVar33 >> 0x20);
          local_798.data._M_elems[4] = (uint)uVar16;
          local_798.data._M_elems[5] = (uint)((ulong)uVar16 >> 0x20);
          local_798.data._M_elems[6] = (uint)uVar17;
          local_798.data._M_elems[7] = (uint)((ulong)uVar17 >> 0x20);
          local_798.data._M_elems[0] = (uint)uVar14;
          local_798.data._M_elems[1] = (uint)((ulong)uVar14 >> 0x20);
          local_798.data._M_elems[2] = (uint)uVar15;
          local_798.data._M_elems[3] = (uint)((ulong)uVar15 >> 0x20);
          if (((local_798.fpclass == cpp_dec_float_NaN) || (local_5a8.fpclass == cpp_dec_float_NaN))
             || (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_798,&local_5a8), iVar27 < 1)) {
            result_4.m_backend.data._M_elems[2] = local_5a8.data._M_elems[2];
            result_4.m_backend.data._M_elems[3] = local_5a8.data._M_elems[3];
            result_4.m_backend.data._M_elems[0] = local_5a8.data._M_elems[0];
            result_4.m_backend.data._M_elems[1] = local_5a8.data._M_elems[1];
            auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
            result_4.m_backend.data._M_elems._32_5_ = local_5a8.data._M_elems._32_5_;
            result_4.m_backend.data._M_elems[9]._1_3_ = local_5a8.data._M_elems[9]._1_3_;
            result_4.m_backend.data._M_elems[4] = local_5a8.data._M_elems[4];
            result_4.m_backend.data._M_elems[5] = local_5a8.data._M_elems[5];
            result_4.m_backend.data._M_elems[6] = local_5a8.data._M_elems[6];
            result_4.m_backend.data._M_elems[7] =
                 (uint)(CONCAT35(local_5a8.data._M_elems[7]._1_3_,local_5a8.data._M_elems._24_5_) >>
                       0x20);
            result_4.m_backend.exp = local_5a8.exp;
            result_4.m_backend.neg = local_5a8.neg;
            result_4.m_backend.fpclass = local_5a8.fpclass;
            result_4.m_backend.prec_elem = local_5a8.prec_elem;
            result_4.m_backend.data._M_elems[0] = local_5a8.data._M_elems[0];
            if (result_4.m_backend.data._M_elems[0] != 0 ||
                local_5a8.fpclass != cpp_dec_float_finite) {
              result_4.m_backend.neg = (bool)(local_5a8.neg ^ 1);
            }
            result_4.m_backend.data._M_elems._0_16_ = auVar20;
            if (((local_5a8.fpclass == cpp_dec_float_NaN) ||
                (local_798.fpclass == cpp_dec_float_NaN)) ||
               (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_798,&result_4.m_backend), -1 < iVar27)) {
              lVar35 = *(long *)(lVar9 + 0x60);
              lVar38 = *(long *)(lVar9 + 0x70);
              lVar37 = (long)*(int *)(lVar35 + -4 + uVar40 * 4) * 0x38;
              *(undefined8 *)(lVar38 + 0x30 + lVar37) = 0xa00000000;
              *(undefined1 (*) [16])(lVar38 + lVar37) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar38 + 0x10 + lVar37) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar38 + 0x1d + lVar37) = (undefined1  [16])0x0;
              iVar25 = *(int *)(lVar9 + 0x58);
              *(int *)(lVar9 + 0x58) = iVar25 + -1;
              *(undefined4 *)(lVar35 + -4 + uVar40 * 4) =
                   *(undefined4 *)(lVar35 + -4 + (long)iVar25 * 4);
              uVar22 = result_4.m_backend._48_8_;
            }
            else {
              pcVar29 = (cpp_dec_float<50U,_int,_void> *)(*plVar12 + lVar38);
              result_4.m_backend.fpclass = cpp_dec_float_finite;
              result_4.m_backend.prec_elem = 10;
              result_4.m_backend.data._M_elems[0] = 0;
              result_4.m_backend.data._M_elems[1] = 0;
              result_4.m_backend.data._M_elems[2] = 0;
              result_4.m_backend.data._M_elems[3] = 0;
              result_4.m_backend.data._M_elems[4] = 0;
              result_4.m_backend.data._M_elems[5] = 0;
              result_4.m_backend.data._M_elems[6] = 0;
              result_4.m_backend.data._M_elems[7] = 0;
              result_4.m_backend.data._M_elems._32_5_ = 0;
              result_4.m_backend.data._M_elems[9]._1_3_ = 0;
              result_4.m_backend.exp = 0;
              result_4.m_backend.neg = false;
              if (&result_4.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar8 + lVar38)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&result_4.m_backend,pcVar29);
                if (result_4.m_backend.data._M_elems[0] != 0 ||
                    result_4.m_backend.fpclass != cpp_dec_float_finite) {
                  result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
                }
              }
              else {
                if (&result_4.m_backend != pcVar29) {
                  uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 8);
                  result_4.m_backend.data._M_elems._32_5_ = SUB85(uVar33,0);
                  result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
                  result_4.m_backend.data._M_elems._0_16_ =
                       *(undefined1 (*) [16])(pcVar29->data)._M_elems;
                  uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 4);
                  uVar14 = *(undefined8 *)((pcVar29->data)._M_elems + 6);
                  result_4.m_backend.data._M_elems[4] = (uint)uVar33;
                  result_4.m_backend.data._M_elems[5] = (uint)((ulong)uVar33 >> 0x20);
                  result_4.m_backend.data._M_elems[6] = (uint)uVar14;
                  result_4.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
                  result_4.m_backend.exp = pcVar29->exp;
                  result_4.m_backend.neg = pcVar29->neg;
                  result_4.m_backend.fpclass = pcVar29->fpclass;
                  result_4.m_backend.prec_elem = pcVar29->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&result_4.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar8 + lVar38));
              }
              local_758.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
              local_758.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
              local_758.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
              local_758.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
              local_758.data._M_elems._24_5_ =
                   SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],
                                  result_4.m_backend.data._M_elems[6]),0);
              local_758.data._M_elems[7]._1_3_ =
                   (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
              local_758.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
              local_758.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
              local_758.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
              local_758.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
              local_758.exp = result_4.m_backend.exp;
              local_758.neg = result_4.m_backend.neg;
              local_758.fpclass = result_4.m_backend.fpclass;
              local_758.prec_elem = result_4.m_backend.prec_elem;
              result_4.m_backend.data._M_elems._32_5_ = degeneps.m_backend.data._M_elems._32_5_;
              result_4.m_backend.data._M_elems[9]._1_3_ = degeneps.m_backend.data._M_elems[9]._1_3_;
              result_4.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
              result_4.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
              result_4.m_backend.data._M_elems[6] = degeneps.m_backend.data._M_elems[6];
              result_4.m_backend.data._M_elems[7] = degeneps.m_backend.data._M_elems[7];
              result_4.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
              result_4.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
              result_4.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              result_4.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
              auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
              result_4.m_backend.exp = degeneps.m_backend.exp;
              result_4.m_backend.neg = degeneps.m_backend.neg;
              uVar19._4_4_ = degeneps.m_backend.prec_elem;
              uVar19._0_4_ = degeneps.m_backend.fpclass;
              result_4.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
              }
              fVar26 = result_4.m_backend.fpclass;
              result_4.m_backend.data._M_elems._0_16_ = auVar20;
              result_4.m_backend._48_8_ = uVar19;
              if ((degeneps.m_backend.fpclass == cpp_dec_float_NaN || fVar26 == cpp_dec_float_NaN)
                 || (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_758,&result_4.m_backend), -1 < iVar27)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                          (&local_758,&local_798);
                uVar22 = result_4.m_backend._48_8_;
                if ((local_758.fpclass != cpp_dec_float_NaN) &&
                   ((local_568.fpclass != cpp_dec_float_NaN &&
                    (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_758,&local_568), uVar22 = result_4.m_backend._48_8_,
                    -1 < iVar27)))) {
                  result_4.m_backend.data._M_elems[1] = local_798.data._M_elems[1];
                  result_4.m_backend.data._M_elems[0] = local_798.data._M_elems[0];
                  result_4.m_backend.data._M_elems[3] = local_798.data._M_elems[3];
                  result_4.m_backend.data._M_elems[2] = local_798.data._M_elems[2];
                  result_4.m_backend.data._M_elems._32_5_ =
                       SUB85(CONCAT44(local_798.data._M_elems[9],local_798.data._M_elems[8]),0);
                  result_4.m_backend.data._M_elems[9]._1_3_ =
                       (undefined3)(local_798.data._M_elems[9] >> 8);
                  result_4.m_backend.data._M_elems[4] = local_798.data._M_elems[4];
                  result_4.m_backend.data._M_elems[5] = local_798.data._M_elems[5];
                  result_4.m_backend.data._M_elems[6] = local_798.data._M_elems[6];
                  result_4.m_backend.data._M_elems[7] = local_798.data._M_elems[7];
                  result_4.m_backend.exp = local_798.exp;
                  result_4.m_backend.neg = local_798.neg;
                  uVar22._0_4_ = local_798.fpclass;
                  uVar22._4_4_ = local_798.prec_elem;
                  result_4.m_backend.fpclass = local_798.fpclass;
                  result_4.m_backend.prec_elem = local_798.prec_elem;
                  if (local_798.data._M_elems[0] != 0 || local_798.fpclass != cpp_dec_float_finite)
                  {
                    result_4.m_backend.neg = (bool)(local_798.neg ^ 1);
                  }
                  if (((local_798.fpclass != cpp_dec_float_NaN) &&
                      (uVar22 = result_4.m_backend._48_8_, local_678.fpclass != cpp_dec_float_NaN))
                     && (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  compare(&result_4.m_backend,&local_678),
                        uVar22 = result_4.m_backend._48_8_, 0 < iVar27)) {
                    iVar27 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(extraout_var_32,iVar27),iVar25);
                    local_678.neg =
                         (bool)((local_798.data._M_elems[0] != 0 ||
                                local_798.fpclass != cpp_dec_float_finite) ^ local_798.neg);
                    goto LAB_002ae8ce;
                  }
                }
              }
              else {
                iVar27 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                lVar35 = *plVar8;
                local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar35 + lVar38);
                local_228.m_backend.data._M_elems._8_8_ =
                     *(undefined8 *)((uint *)(lVar35 + lVar38) + 2);
                puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
                local_228.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                local_228.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
                local_228.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar35 + 0x20 + lVar38);
                local_228.m_backend.exp = *(int *)(lVar35 + 0x28 + lVar38);
                local_228.m_backend.neg = *(bool *)(lVar35 + 0x2c + lVar38);
                local_228.m_backend._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
                SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::shiftUCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_33,iVar27),iVar25,&local_228);
                uVar22 = result_4.m_backend._48_8_;
              }
            }
          }
          else {
            pcVar29 = (cpp_dec_float<50U,_int,_void> *)(*plVar13 + lVar38);
            result_4.m_backend.fpclass = cpp_dec_float_finite;
            result_4.m_backend.prec_elem = 10;
            result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
            result_4.m_backend.data._M_elems[4] = 0;
            result_4.m_backend.data._M_elems[5] = 0;
            result_4.m_backend.data._M_elems[6] = 0;
            result_4.m_backend.data._M_elems[7] = 0;
            result_4.m_backend.data._M_elems._32_5_ = 0;
            result_4.m_backend.data._M_elems[9]._1_3_ = 0;
            result_4.m_backend.exp = 0;
            result_4.m_backend.neg = false;
            if (&result_4.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar8 + lVar38)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&result_4.m_backend,pcVar29);
              if (result_4.m_backend.data._M_elems[0] != 0 ||
                  result_4.m_backend.fpclass != cpp_dec_float_finite) {
                result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
              }
            }
            else {
              if (&result_4.m_backend != pcVar29) {
                uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 8);
                result_4.m_backend.data._M_elems._32_5_ = SUB85(uVar33,0);
                result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
                result_4.m_backend.data._M_elems._0_16_ =
                     *(undefined1 (*) [16])(pcVar29->data)._M_elems;
                uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 4);
                uVar14 = *(undefined8 *)((pcVar29->data)._M_elems + 6);
                result_4.m_backend.data._M_elems[4] = (uint)uVar33;
                result_4.m_backend.data._M_elems[5] = (uint)((ulong)uVar33 >> 0x20);
                result_4.m_backend.data._M_elems[6] = (uint)uVar14;
                result_4.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
                result_4.m_backend.exp = pcVar29->exp;
                result_4.m_backend.neg = pcVar29->neg;
                result_4.m_backend.fpclass = pcVar29->fpclass;
                result_4.m_backend.prec_elem = pcVar29->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&result_4.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar8 + lVar38));
            }
            auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
            local_758.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
            local_758.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
            local_758.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
            local_758.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
            local_758.data._M_elems._24_5_ =
                 SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],
                                result_4.m_backend.data._M_elems[6]),0);
            local_758.data._M_elems[7]._1_3_ =
                 (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
            local_758.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
            local_758.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
            local_758.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
            local_758.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
            local_758.exp = result_4.m_backend.exp;
            local_758.neg = result_4.m_backend.neg;
            local_758.fpclass = result_4.m_backend.fpclass;
            local_758.prec_elem = result_4.m_backend.prec_elem;
            result_4.m_backend.data._M_elems._0_16_ = auVar20;
            if (((result_4.m_backend.fpclass == cpp_dec_float_NaN) ||
                (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
               (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_758,&degeneps.m_backend), iVar27 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                        (&local_758,&local_798);
              uVar22 = result_4.m_backend._48_8_;
              if (((local_758.fpclass != cpp_dec_float_NaN) &&
                  (local_568.fpclass != cpp_dec_float_NaN)) &&
                 ((iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                      (&local_758,&local_568), uVar22 = result_4.m_backend._48_8_,
                  -1 < iVar27 &&
                  (((local_798.fpclass != cpp_dec_float_NaN &&
                    (local_678.fpclass != cpp_dec_float_NaN)) &&
                   (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_798,&local_678), uVar22 = result_4.m_backend._48_8_,
                   0 < iVar27)))))) {
                iVar27 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_31,iVar27),iVar25);
                local_678.neg = local_798.neg;
LAB_002ae8ce:
                local_690 = uVar40 - 1 & 0xffffffff;
                uVar22 = result_4.m_backend._48_8_;
                local_718.data._M_elems._0_8_ = local_758.data._M_elems._0_8_;
                local_718.data._M_elems._8_8_ = local_758.data._M_elems._8_8_;
                local_718.data._M_elems._16_8_ = local_758.data._M_elems._16_8_;
                local_718.data._M_elems._24_5_ = local_758.data._M_elems._24_5_;
                local_718.data._M_elems[7]._1_3_ = local_758.data._M_elems[7]._1_3_;
                local_718.data._M_elems._32_5_ = local_758.data._M_elems._32_5_;
                local_718.data._M_elems[9]._1_3_ = local_758.data._M_elems[9]._1_3_;
                local_718.exp = local_758.exp;
                local_718.neg = local_758.neg;
                local_718._48_8_ = local_758._48_8_;
                local_678.data._M_elems[0] = local_798.data._M_elems[0];
                local_678.data._M_elems[1] = local_798.data._M_elems[1];
                local_678.data._M_elems[2] = local_798.data._M_elems[2];
                local_678.data._M_elems[3] = local_798.data._M_elems[3];
                local_678.data._M_elems[4] = local_798.data._M_elems[4];
                local_678.data._M_elems[5] = local_798.data._M_elems[5];
                local_678.data._M_elems[6] = local_798.data._M_elems[6];
                local_678.data._M_elems[7] = local_798.data._M_elems[7];
                local_678.data._M_elems[8] = local_798.data._M_elems[8];
                local_678.data._M_elems[9] = local_798.data._M_elems[9];
                local_678.exp = local_798.exp;
                local_678._48_8_ = local_798._48_8_;
              }
            }
            else {
              iVar27 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              lVar35 = *plVar8;
              local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar35 + lVar38);
              local_1e8.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((uint *)(lVar35 + lVar38) + 2);
              puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
              local_1e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_1e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_1e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar35 + 0x20 + lVar38);
              local_1e8.m_backend.exp = *(int *)(lVar35 + 0x28 + lVar38);
              local_1e8.m_backend.neg = *(bool *)(lVar35 + 0x2c + lVar38);
              local_1e8.m_backend._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::shiftLCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_30,iVar27),iVar25,&local_1e8);
              uVar22 = result_4.m_backend._48_8_;
            }
          }
          result_4.m_backend._48_8_ = uVar22;
          bVar24 = 1 < (long)uVar40;
          uVar40 = uVar40 - 1;
        } while (bVar24);
      }
      iVar25 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])();
      (**(code **)(*(long *)CONCAT44(extraout_var_34,iVar25) + 0x368))
                (&result_4,(long *)CONCAT44(extraout_var_34,iVar25));
    } while (((local_4a8.fpclass == cpp_dec_float_NaN) ||
             (result_4.m_backend.fpclass == cpp_dec_float_NaN)) ||
            (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_4a8,&result_4.m_backend), iVar25 != 0));
    if (-1 < (int)local_690) {
      iVar25 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])();
      bVar24 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_35,iVar25),&enterId);
      if (!bVar24) goto LAB_002ad397;
      lVar35 = *(long *)(lVar9 + 0x60);
      lVar38 = *(long *)(lVar9 + 0x70);
      lVar37 = (long)*(int *)(lVar35 + local_690 * 4) * 0x38;
      *(undefined8 *)(lVar38 + 0x30 + lVar37) = 0xa00000000;
      *(undefined1 (*) [16])(lVar38 + lVar37) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar38 + 0x10 + lVar37) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar38 + 0x1d + lVar37) = (undefined1  [16])0x0;
      iVar25 = *(int *)(lVar9 + 0x58);
      *(int *)(lVar9 + 0x58) = iVar25 + -1;
      *(undefined4 *)(lVar35 + local_690 * 4) = *(undefined4 *)(lVar35 + -4 + (long)iVar25 * 4);
      goto LAB_002ad428;
    }
    if ((int)local_79c < 0) {
LAB_002af172:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&val->m_backend,0);
      enterId.super_DataKey = enterId.super_DataKey & 0xffffffff00000000;
      uVar32._0_4_ = enterId.super_DataKey.info;
      uVar32._4_4_ = enterId.super_DataKey.idx;
      return (SPxId)uVar32;
    }
    iVar25 = (*(this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxRatioTester[3])();
    lVar35 = *(long *)(CONCAT44(extraout_var_36,iVar25) + 0x790);
    lVar38 = *(long *)(lVar35 + 0x20);
    lVar35 = (long)*(int *)(*(long *)(lVar35 + 0x28) + 4 + (ulong)local_79c * 8);
    result_4.m_backend.fpclass = cpp_dec_float_finite;
    result_4.m_backend.prec_elem = 10;
    result_4.m_backend.data._M_elems[0] = 0;
    result_4.m_backend.data._M_elems[1] = 0;
    result_4.m_backend.data._M_elems[2] = 0;
    result_4.m_backend.data._M_elems[3] = 0;
    result_4.m_backend.data._M_elems[4] = 0;
    result_4.m_backend.data._M_elems[5] = 0;
    result_4.m_backend.data._M_elems[6] = 0;
    result_4.m_backend.data._M_elems[7] = 0;
    result_4.m_backend.data._M_elems._32_5_ = 0;
    result_4.m_backend.data._M_elems[9]._1_3_ = 0;
    result_4.m_backend.exp = 0;
    result_4.m_backend.neg = false;
    iVar25 = *(int *)(lVar38 + 0xc + lVar35 * 0x28);
    if (0 < iVar25) {
      pcVar29 = *(cpp_dec_float<50U,_int,_void> **)(lVar38 + lVar35 * 0x28);
      iVar25 = iVar25 + 1;
      do {
        pcVar30 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)(int)pcVar29[1].data._M_elems[0] * 0x38 + *plVar8);
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        pcVar36 = pcVar29;
        if ((&result_1.m_backend != pcVar30) && (pcVar36 = pcVar30, pcVar29 != &result_1.m_backend))
        {
          uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 8);
          result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar33,0);
          result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
          result_1.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar29->data)._M_elems;
          uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 4);
          uVar14 = *(undefined8 *)((pcVar29->data)._M_elems + 6);
          result_1.m_backend.data._M_elems[4] = (uint)uVar33;
          result_1.m_backend.data._M_elems[5] = (uint)((ulong)uVar33 >> 0x20);
          result_1.m_backend.data._M_elems[6] = (uint)uVar14;
          result_1.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
          result_1.m_backend.exp = pcVar29->exp;
          result_1.m_backend.neg = pcVar29->neg;
          result_1.m_backend.fpclass = pcVar29->fpclass;
          result_1.m_backend.prec_elem = pcVar29->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result_1.m_backend,pcVar36);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&result_4.m_backend,&result_1.m_backend);
        pcVar29 = (cpp_dec_float<50U,_int,_void> *)(pcVar29[1].data._M_elems + 1);
        iVar25 = iVar25 + -1;
      } while (1 < iVar25);
    }
    result_1.m_backend.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
    result_1.m_backend.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
    uVar33 = result_4.m_backend.data._M_elems._0_8_;
    uVar14 = result_4.m_backend.data._M_elems._8_8_;
    result_1.m_backend.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
    result_1.m_backend.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
    result_1.m_backend.data._M_elems[6] = result_4.m_backend.data._M_elems[6];
    result_1.m_backend.data._M_elems[7] = result_4.m_backend.data._M_elems[7];
    result_1.m_backend.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
    result_1.m_backend.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
    result_1.m_backend.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
    result_1.m_backend.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
    lVar35 = *plVar6;
    lVar38 = (ulong)local_79c * 0x38;
    *(ulong *)(lVar35 + 0x20 + lVar38) =
         CONCAT35(result_4.m_backend.data._M_elems[9]._1_3_,result_4.m_backend.data._M_elems._32_5_)
    ;
    puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
    *puVar2 = result_4.m_backend.data._M_elems[4];
    puVar2[1] = result_4.m_backend.data._M_elems[5];
    puVar2[2] = result_4.m_backend.data._M_elems[6];
    puVar2[3] = result_4.m_backend.data._M_elems[7];
    *(undefined8 *)(lVar35 + lVar38) = uVar33;
    *(undefined8 *)((uint *)(lVar35 + lVar38) + 2) = uVar14;
    *(int *)(lVar35 + 0x28 + lVar38) = result_4.m_backend.exp;
    *(bool *)(lVar35 + 0x2c + lVar38) = result_4.m_backend.neg;
    *(undefined8 *)(lVar35 + 0x30 + lVar38) = result_4.m_backend._48_8_;
    iVar25 = (*(this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxRatioTester[3])();
    bVar24 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(extraout_var_37,iVar25),&enterId);
    if (bVar24) {
      local_78 = 0xa00000000;
      local_a8[0] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[1] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[2] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[3] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[4] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[5] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[6] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[7] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[8] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[9] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[10] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[0xb] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[0xc] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[0xd] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[0xe] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[0xf] = (cpp_dec_float<50u,int,void>)0x0;
      local_98 = SUB1613((undefined1  [16])0x0,0);
      uStack_8b = 0;
      auStack_88 = SUB1613((undefined1  [16])0x0,3);
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(local_a8,0.0);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setValue((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)(lVar7 + 0x50),local_79c,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_a8);
      goto LAB_002ad428;
    }
    lVar35 = *(long *)(lVar7 + 0x70);
    local_798.exp = *(int *)(lVar35 + 0x28 + lVar38);
    local_798.neg = *(bool *)(lVar35 + 0x2c + lVar38);
    local_798._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
    uVar14 = *(undefined8 *)(lVar35 + lVar38);
    uVar15 = ((undefined8 *)(lVar35 + lVar38))[1];
    puVar1 = (undefined8 *)(lVar35 + 0x10 + lVar38);
    uVar16 = *puVar1;
    uVar17 = puVar1[1];
    uVar33 = *(undefined8 *)(lVar35 + 0x20 + lVar38);
    local_798.data._M_elems[8] = (uint)uVar33;
    local_798.data._M_elems[9] = (uint)((ulong)uVar33 >> 0x20);
    local_798.data._M_elems[4] = (uint)uVar16;
    local_798.data._M_elems[5] = (uint)((ulong)uVar16 >> 0x20);
    local_798.data._M_elems[6] = (uint)uVar17;
    local_798.data._M_elems[7] = (uint)((ulong)uVar17 >> 0x20);
    local_798.data._M_elems[0] = (uint)uVar14;
    local_798.data._M_elems[1] = (uint)((ulong)uVar14 >> 0x20);
    local_798.data._M_elems[2] = (uint)uVar15;
    local_798.data._M_elems[3] = (uint)((ulong)uVar15 >> 0x20);
    if (local_798.fpclass == cpp_dec_float_NaN) {
LAB_002aed4f:
      pcVar29 = (cpp_dec_float<50U,_int,_void> *)(*plVar10 + lVar38);
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 10;
      result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems._32_5_ = 0;
      result_4.m_backend.data._M_elems[9]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      if (&result_4.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar38)) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&result_4.m_backend,pcVar29);
        if (result_4.m_backend.data._M_elems[0] != 0 ||
            result_4.m_backend.fpclass != cpp_dec_float_finite) {
          result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
        }
      }
      else {
        if (&result_4.m_backend != pcVar29) {
          uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 8);
          result_4.m_backend.data._M_elems._32_5_ = SUB85(uVar33,0);
          result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
          result_4.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar29->data)._M_elems;
          uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 4);
          uVar14 = *(undefined8 *)((pcVar29->data)._M_elems + 6);
          result_4.m_backend.data._M_elems[4] = (uint)uVar33;
          result_4.m_backend.data._M_elems[5] = (uint)((ulong)uVar33 >> 0x20);
          result_4.m_backend.data._M_elems[6] = (uint)uVar14;
          result_4.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
          result_4.m_backend.exp = pcVar29->exp;
          result_4.m_backend.neg = pcVar29->neg;
          result_4.m_backend.fpclass = pcVar29->fpclass;
          result_4.m_backend.prec_elem = pcVar29->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&result_4.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar38));
      }
      local_718.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
      local_718.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
      local_718.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
      local_718.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
      local_718.data._M_elems._24_5_ =
           SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],result_4.m_backend.data._M_elems[6]),0
                );
      local_718.data._M_elems[7]._1_3_ = (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
      local_718.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
      local_718.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
      local_718.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
      local_718.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
      local_718.exp = result_4.m_backend.exp;
      local_718.neg = result_4.m_backend.neg;
      local_718.fpclass = result_4.m_backend.fpclass;
      local_718.prec_elem = result_4.m_backend.prec_elem;
      result_4.m_backend.data._M_elems._32_5_ =
           SUB85(CONCAT44(local_798.data._M_elems[9],local_798.data._M_elems[8]),0);
      result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)(local_798.data._M_elems[9] >> 8);
      result_4.m_backend.data._M_elems[1] = local_798.data._M_elems[1];
      result_4.m_backend.data._M_elems[0] = local_798.data._M_elems[0];
      result_4.m_backend.data._M_elems[3] = local_798.data._M_elems[3];
      result_4.m_backend.data._M_elems[2] = local_798.data._M_elems[2];
      result_4.m_backend.data._M_elems[4] = local_798.data._M_elems[4];
      result_4.m_backend.data._M_elems[5] = local_798.data._M_elems[5];
      result_4.m_backend.data._M_elems[6] = local_798.data._M_elems[6];
      result_4.m_backend.data._M_elems[7] = local_798.data._M_elems[7];
      result_4.m_backend.exp = local_798.exp;
      result_4.m_backend.neg = local_798.neg;
      result_4.m_backend.fpclass = local_798.fpclass;
      result_4.m_backend.prec_elem = local_798.prec_elem;
      if (local_798.data._M_elems[0] != 0 || local_798.fpclass != cpp_dec_float_finite) {
        result_4.m_backend.neg = (bool)(local_798.neg ^ 1);
      }
      uVar21 = result_4.m_backend._48_8_;
      if (((((local_798.fpclass != cpp_dec_float_NaN) &&
            (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result_4.m_backend,&minStability.m_backend),
           uVar21 = result_4.m_backend._48_8_, iVar25 < 0)) &&
          ((local_718.fpclass != cpp_dec_float_NaN &&
           ((this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta.m_backend.fpclass != cpp_dec_float_NaN)))) &&
         (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_718,&pnVar28->m_backend), uVar21 = result_4.m_backend._48_8_,
         iVar25 < 0)) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::div_unsigned_long_long
                  (&minStability.m_backend,2);
        iVar25 = (*(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        lVar35 = *plVar6;
        local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar35 + lVar38);
        local_2a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar35 + lVar38) + 2);
        puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
        local_2a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_2a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_2a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar35 + 0x20 + lVar38);
        local_2a8.m_backend.exp = *(int *)(lVar35 + 0x28 + lVar38);
        local_2a8.m_backend.neg = *(bool *)(lVar35 + 0x2c + lVar38);
        local_2a8.m_backend._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(extraout_var_38,iVar25),local_79c,&local_2a8);
        goto LAB_002ad428;
      }
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&result_4.m_backend,0,(type *)0x0);
      iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_798,&result_4.m_backend);
      if (iVar25 < 1) goto LAB_002aed4f;
      pcVar29 = (cpp_dec_float<50U,_int,_void> *)(*plVar11 + lVar38);
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 10;
      result_4.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems._32_5_ = 0;
      result_4.m_backend.data._M_elems[9]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      if (&result_4.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar38)) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&result_4.m_backend,pcVar29);
        if (result_4.m_backend.data._M_elems[0] != 0 ||
            result_4.m_backend.fpclass != cpp_dec_float_finite) {
          result_4.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
        }
      }
      else {
        if (&result_4.m_backend != pcVar29) {
          uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 8);
          result_4.m_backend.data._M_elems._32_5_ = SUB85(uVar33,0);
          result_4.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar33 >> 0x28);
          result_4.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar29->data)._M_elems;
          uVar33 = *(undefined8 *)((pcVar29->data)._M_elems + 4);
          uVar14 = *(undefined8 *)((pcVar29->data)._M_elems + 6);
          result_4.m_backend.data._M_elems[4] = (uint)uVar33;
          result_4.m_backend.data._M_elems[5] = (uint)((ulong)uVar33 >> 0x20);
          result_4.m_backend.data._M_elems[6] = (uint)uVar14;
          result_4.m_backend.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
          result_4.m_backend.exp = pcVar29->exp;
          result_4.m_backend.neg = pcVar29->neg;
          result_4.m_backend.fpclass = pcVar29->fpclass;
          result_4.m_backend.prec_elem = pcVar29->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&result_4.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar6 + lVar38));
      }
      auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
      local_718.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
      local_718.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
      local_718.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
      local_718.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
      local_718.data._M_elems._24_5_ =
           SUB85(CONCAT44(result_4.m_backend.data._M_elems[7],result_4.m_backend.data._M_elems[6]),0
                );
      local_718.data._M_elems[7]._1_3_ = (undefined3)(result_4.m_backend.data._M_elems[7] >> 8);
      local_718.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
      local_718.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
      local_718.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
      local_718.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
      local_718.exp = result_4.m_backend.exp;
      local_718.neg = result_4.m_backend.neg;
      local_718.fpclass = result_4.m_backend.fpclass;
      local_718.prec_elem = result_4.m_backend.prec_elem;
      result_4.m_backend.data._M_elems._0_16_ = auVar20;
      uVar21 = result_4.m_backend._48_8_;
      if (((local_798.fpclass != cpp_dec_float_NaN) &&
          (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_798,&minStability.m_backend),
         uVar21 = result_4.m_backend._48_8_, iVar25 < 0)) {
        result_4.m_backend.data._M_elems[2] = local_718.data._M_elems[2];
        result_4.m_backend.data._M_elems[3] = local_718.data._M_elems[3];
        result_4.m_backend.data._M_elems[0] = local_718.data._M_elems[0];
        result_4.m_backend.data._M_elems[1] = local_718.data._M_elems[1];
        auVar20 = (undefined1  [16])result_4.m_backend.data._M_elems._0_16_;
        result_4.m_backend.data._M_elems._32_5_ = local_718.data._M_elems._32_5_;
        result_4.m_backend.data._M_elems[9]._1_3_ = local_718.data._M_elems[9]._1_3_;
        result_4.m_backend.data._M_elems[4] = local_718.data._M_elems[4];
        result_4.m_backend.data._M_elems[5] = local_718.data._M_elems[5];
        result_4.m_backend.data._M_elems[6] = local_718.data._M_elems[6];
        result_4.m_backend.data._M_elems[7] =
             (uint)(CONCAT35(local_718.data._M_elems[7]._1_3_,local_718.data._M_elems._24_5_) >>
                   0x20);
        result_4.m_backend.exp = local_718.exp;
        result_4.m_backend.neg = local_718.neg;
        uVar21._0_4_ = local_718.fpclass;
        uVar21._4_4_ = local_718.prec_elem;
        result_4.m_backend.fpclass = local_718.fpclass;
        result_4.m_backend.prec_elem = local_718.prec_elem;
        result_4.m_backend.data._M_elems[0] = local_718.data._M_elems[0];
        if (result_4.m_backend.data._M_elems[0] != 0 || local_718.fpclass != cpp_dec_float_finite) {
          result_4.m_backend.neg = (bool)(local_718.neg ^ 1);
        }
        result_4.m_backend.data._M_elems._0_16_ = auVar20;
        if (((local_718.fpclass != cpp_dec_float_NaN) &&
            (uVar21 = result_4.m_backend._48_8_,
            (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result_4.m_backend,&pnVar28->m_backend),
           uVar21 = result_4.m_backend._48_8_, iVar25 < 0)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::div_unsigned_long_long
                    (&minStability.m_backend,2);
          iVar25 = (*(this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SPxRatioTester[3])();
          lVar35 = *plVar6;
          local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar35 + lVar38);
          local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar35 + lVar38) + 2);
          puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
          local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar35 + 0x20 + lVar38);
          local_268.m_backend.exp = *(int *)(lVar35 + 0x28 + lVar38);
          local_268.m_backend.neg = *(bool *)(lVar35 + 0x2c + lVar38);
          local_268.m_backend._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_39,iVar25),local_79c,&local_268);
          goto LAB_002ad428;
        }
      }
    }
    result_4.m_backend._48_8_ = uVar21;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
              (&local_718,&local_798);
    if (((local_718.fpclass == cpp_dec_float_NaN) || (local_568.fpclass == cpp_dec_float_NaN)) ||
       (iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_718,&local_568), -1 < iVar25)) goto LAB_002ad397;
  } while( true );
}

Assistant:

SPxId SPxHarrisRT<R>::selectEnter(R& val, int, bool)
{
   int i, j;
   SPxId enterId;
   R stab, x, y;
   R max = 0.0;
   R sel = 0.0;
   R lastshift;
   R cuseeps;
   R ruseeps;
   R cmaxabs = 1;
   R rmaxabs = 1;
   int pnr, cnr;

   R minStability = this->tolerances()->scaleAccordingToEpsilon(1e-4);
   R epsilon      = this->solver()->epsilon();
   R degeneps     = degenerateEps();

   VectorBase<R>& pvec = this->solver()->pVec();
   SSVectorBase<R>& pupd = this->solver()->pVec().delta();

   VectorBase<R>& cvec = this->solver()->coPvec();
   SSVectorBase<R>& cupd = this->solver()->coPvec().delta();

   const VectorBase<R>& upb = this->solver()->upBound();
   const VectorBase<R>& lpb = this->solver()->lpBound();
   const VectorBase<R>& ucb = this->solver()->ucBound();
   const VectorBase<R>& lcb = this->solver()->lcBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   if(val > epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);

         // phase 1:
         maxDelta(
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         maxDelta(
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(-infinity);
         ruseeps = rmaxabs * 0.001 * epsilon;

         if(ruseeps < epsilon)
            ruseeps = epsilon;

         cuseeps = cmaxabs * 0.001 * epsilon;

         if(cuseeps < epsilon)
            cuseeps = epsilon;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI01 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI02 removing value {}\n", cupd[i]);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(x < minStability && sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(-x < minStability && -sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel > max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }
   else if(val < -epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);


         // phase 1:
         minDelta
         (
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         minDelta
         (
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(infinity);
         ruseeps = rmaxabs * epsilon * 0.001;
         cuseeps = cmaxabs * epsilon * 0.001;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI03 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI04 removing value {}\n", x);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(x < minStability && -sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(-x < minStability && sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel < max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }

   assert(max * val >= 0);
   assert(enterId.type() != SPxId::INVALID);

   val = sel;

   return enterId;
}